

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O1

bool embree::avx512::CurveNvIntersector1<8>::
     occluded_t<embree::avx512::SweepCurve1Intersector1<embree::BSplineCurveT>,embree::avx512::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  undefined4 uVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  Primitive PVar7;
  Geometry *pGVar8;
  RTCFilterFunctionN p_Var9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  int iVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [12];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  byte bVar68;
  byte bVar69;
  byte bVar70;
  ulong uVar71;
  ulong uVar72;
  byte bVar73;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  Primitive *pPVar74;
  ulong unaff_R12;
  byte bVar75;
  long lVar76;
  bool bVar77;
  bool bVar78;
  ulong uVar79;
  uint uVar80;
  uint uVar133;
  uint uVar134;
  uint uVar136;
  uint uVar137;
  uint uVar138;
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  uint uVar135;
  uint uVar139;
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  float pp;
  float fVar140;
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  float fVar156;
  float fVar157;
  float fVar158;
  float fVar159;
  float fVar160;
  float fVar161;
  float fVar162;
  float fVar163;
  float fVar164;
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  float fVar181;
  float fVar182;
  float fVar200;
  float fVar201;
  float fVar202;
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  float fVar203;
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [64];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 in_ZMM4 [64];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [64];
  float fVar226;
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined4 uVar230;
  undefined1 auVar231 [16];
  undefined1 auVar232 [64];
  float fVar234;
  float fVar235;
  float fVar236;
  float fVar237;
  float fVar238;
  float fVar239;
  float fVar240;
  undefined1 auVar233 [64];
  undefined1 auVar241 [64];
  undefined1 auVar242 [64];
  float fVar245;
  undefined1 auVar243 [32];
  undefined1 auVar244 [64];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [64];
  undefined1 auVar249 [32];
  undefined1 auVar250 [64];
  undefined1 auVar251 [64];
  RTCFilterFunctionNArguments args;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  StackEntry stack [3];
  int local_8cc;
  RayQueryContext *local_8c8;
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  ulong local_868;
  undefined1 local_860 [32];
  undefined1 local_830 [16];
  undefined1 local_820 [16];
  ulong local_808;
  uint local_7fc;
  uint local_7f8;
  undefined4 local_7f4;
  RTCFilterFunctionNArguments local_7f0;
  undefined1 local_7c0 [32];
  undefined8 local_790;
  undefined4 local_788;
  float local_784;
  undefined4 local_780;
  undefined4 local_77c;
  undefined4 local_778;
  uint local_774;
  uint local_770;
  Primitive *local_760;
  Primitive *local_758;
  ulong local_750;
  ulong local_748;
  undefined1 local_740 [8];
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  float fStack_724;
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_630 [16];
  undefined1 local_620 [16];
  undefined1 local_610 [16];
  float local_600;
  float fStack_5fc;
  float fStack_5f8;
  float fStack_5f4;
  undefined1 local_5f0 [16];
  undefined1 local_5e0 [16];
  undefined1 local_5d0 [16];
  float local_5c0;
  float fStack_5bc;
  float fStack_5b8;
  float fStack_5b4;
  undefined1 local_5b0 [16];
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  float local_560;
  float fStack_55c;
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined4 local_4c0;
  undefined4 uStack_4bc;
  undefined4 uStack_4b8;
  undefined4 uStack_4b4;
  undefined4 uStack_4b0;
  undefined4 uStack_4ac;
  undefined4 uStack_4a8;
  undefined4 uStack_4a4;
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [32];
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  byte abStack_180 [32];
  undefined1 auStack_160 [32];
  float afStack_140 [2];
  uint auStack_138 [66];
  undefined1 auVar118 [32];
  undefined1 auVar127 [32];
  undefined1 auVar130 [32];
  
  PVar7 = prim[1];
  uVar71 = (ulong)(byte)PVar7;
  lVar76 = uVar71 * 0x19;
  fVar226 = *(float *)(prim + lVar76 + 0x12);
  auVar87 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                       *(undefined1 (*) [16])(prim + lVar76 + 6));
  fVar181 = fVar226 * (ray->dir).field_0.m128[0];
  fVar203 = fVar226 * auVar87._0_4_;
  auVar83._8_8_ = 0;
  auVar83._0_8_ = *(ulong *)(prim + uVar71 * 4 + 6);
  auVar94 = vpmovsxbd_avx2(auVar83);
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar84._8_8_ = 0;
  auVar84._0_8_ = *(ulong *)(prim + uVar71 * 5 + 6);
  auVar95 = vpmovsxbd_avx2(auVar84);
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)(prim + uVar71 * 6 + 6);
  auVar96 = vpmovsxbd_avx2(auVar4);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + uVar71 * 0xb + 6);
  auVar97 = vpmovsxbd_avx2(auVar5);
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar81._8_8_ = 0;
  auVar81._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar7 * 0xc) + 6);
  auVar98 = vpmovsxbd_avx2(auVar81);
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar85._8_8_ = 0;
  auVar85._0_8_ = *(ulong *)(prim + (uint)(byte)PVar7 * 0xc + uVar71 + 6);
  auVar99 = vpmovsxbd_avx2(auVar85);
  auVar99 = vcvtdq2ps_avx(auVar99);
  uVar79 = (ulong)(uint)((int)(uVar71 * 9) * 2);
  auVar82._8_8_ = 0;
  auVar82._0_8_ = *(ulong *)(prim + uVar79 + 6);
  auVar100 = vpmovsxbd_avx2(auVar82);
  auVar86._8_8_ = 0;
  auVar86._0_8_ = *(ulong *)(prim + uVar79 + uVar71 + 6);
  auVar92 = vpmovsxbd_avx2(auVar86);
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar244 = ZEXT3264(auVar100);
  auVar101 = vcvtdq2ps_avx(auVar92);
  auVar248 = ZEXT3264(auVar101);
  uVar72 = (ulong)(uint)((int)(uVar71 * 5) << 2);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar72 + 6);
  auVar102 = vpmovsxbd_avx2(auVar6);
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar250 = ZEXT3264(auVar102);
  auVar108._4_4_ = fVar181;
  auVar108._0_4_ = fVar181;
  auVar108._8_4_ = fVar181;
  auVar108._12_4_ = fVar181;
  auVar108._16_4_ = fVar181;
  auVar108._20_4_ = fVar181;
  auVar108._24_4_ = fVar181;
  auVar108._28_4_ = fVar181;
  auVar88 = vbroadcastss_avx512vl(ZEXT416(1));
  auVar93 = ZEXT1632(CONCAT412(fVar226 * (ray->dir).field_0.m128[3],
                               CONCAT48(fVar226 * (ray->dir).field_0.m128[2],
                                        CONCAT44(fVar226 * (ray->dir).field_0.m128[1],fVar181))));
  auVar89 = vpermps_avx512vl(auVar88,auVar93);
  auVar90 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar91 = vpermps_avx512vl(auVar90,auVar93);
  fVar181 = auVar91._0_4_;
  auVar251._0_4_ = fVar181 * auVar96._0_4_;
  fVar234 = auVar91._4_4_;
  auVar251._4_4_ = fVar234 * auVar96._4_4_;
  fVar236 = auVar91._8_4_;
  auVar251._8_4_ = fVar236 * auVar96._8_4_;
  fVar238 = auVar91._12_4_;
  auVar251._12_4_ = fVar238 * auVar96._12_4_;
  fVar159 = auVar91._16_4_;
  auVar251._16_4_ = fVar159 * auVar96._16_4_;
  fVar161 = auVar91._20_4_;
  auVar251._20_4_ = fVar161 * auVar96._20_4_;
  fVar163 = auVar91._24_4_;
  auVar251._28_36_ = in_ZMM4._28_36_;
  auVar251._24_4_ = fVar163 * auVar96._24_4_;
  auVar93._4_4_ = auVar99._4_4_ * fVar234;
  auVar93._0_4_ = auVar99._0_4_ * fVar181;
  auVar93._8_4_ = auVar99._8_4_ * fVar236;
  auVar93._12_4_ = auVar99._12_4_ * fVar238;
  auVar93._16_4_ = auVar99._16_4_ * fVar159;
  auVar93._20_4_ = auVar99._20_4_ * fVar161;
  auVar93._24_4_ = auVar99._24_4_ * fVar163;
  auVar93._28_4_ = auVar92._28_4_;
  auVar92._4_4_ = auVar102._4_4_ * fVar234;
  auVar92._0_4_ = auVar102._0_4_ * fVar181;
  auVar92._8_4_ = auVar102._8_4_ * fVar236;
  auVar92._12_4_ = auVar102._12_4_ * fVar238;
  auVar92._16_4_ = auVar102._16_4_ * fVar159;
  auVar92._20_4_ = auVar102._20_4_ * fVar161;
  auVar92._24_4_ = auVar102._24_4_ * fVar163;
  auVar92._28_4_ = auVar91._28_4_;
  auVar83 = vfmadd231ps_fma(auVar251._0_32_,auVar89,auVar95);
  auVar84 = vfmadd231ps_fma(auVar93,auVar89,auVar98);
  auVar4 = vfmadd231ps_fma(auVar92,auVar101,auVar89);
  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar108,auVar94);
  auVar84 = vfmadd231ps_fma(ZEXT1632(auVar84),auVar108,auVar97);
  auVar4 = vfmadd231ps_fma(ZEXT1632(auVar4),auVar100,auVar108);
  auVar109._4_4_ = fVar203;
  auVar109._0_4_ = fVar203;
  auVar109._8_4_ = fVar203;
  auVar109._12_4_ = fVar203;
  auVar109._16_4_ = fVar203;
  auVar109._20_4_ = fVar203;
  auVar109._24_4_ = fVar203;
  auVar109._28_4_ = fVar203;
  auVar93 = ZEXT1632(CONCAT412(fVar226 * auVar87._12_4_,
                               CONCAT48(fVar226 * auVar87._8_4_,
                                        CONCAT44(fVar226 * auVar87._4_4_,fVar203))));
  auVar92 = vpermps_avx512vl(auVar88,auVar93);
  auVar93 = vpermps_avx512vl(auVar90,auVar93);
  fVar226 = auVar93._0_4_;
  fVar181 = auVar93._4_4_;
  auVar88._4_4_ = fVar181 * auVar96._4_4_;
  auVar88._0_4_ = fVar226 * auVar96._0_4_;
  fVar234 = auVar93._8_4_;
  auVar88._8_4_ = fVar234 * auVar96._8_4_;
  fVar236 = auVar93._12_4_;
  auVar88._12_4_ = fVar236 * auVar96._12_4_;
  fVar238 = auVar93._16_4_;
  auVar88._16_4_ = fVar238 * auVar96._16_4_;
  fVar159 = auVar93._20_4_;
  auVar88._20_4_ = fVar159 * auVar96._20_4_;
  fVar161 = auVar93._24_4_;
  auVar88._24_4_ = fVar161 * auVar96._24_4_;
  auVar88._28_4_ = auVar96._28_4_;
  auVar104._0_4_ = auVar99._0_4_ * fVar226;
  auVar104._4_4_ = auVar99._4_4_ * fVar181;
  auVar104._8_4_ = auVar99._8_4_ * fVar234;
  auVar104._12_4_ = auVar99._12_4_ * fVar236;
  auVar104._16_4_ = auVar99._16_4_ * fVar238;
  auVar104._20_4_ = auVar99._20_4_ * fVar159;
  auVar104._24_4_ = auVar99._24_4_ * fVar161;
  auVar104._28_4_ = 0;
  auVar99._4_4_ = auVar102._4_4_ * fVar181;
  auVar99._0_4_ = auVar102._0_4_ * fVar226;
  auVar99._8_4_ = auVar102._8_4_ * fVar234;
  auVar99._12_4_ = auVar102._12_4_ * fVar236;
  auVar99._16_4_ = auVar102._16_4_ * fVar238;
  auVar99._20_4_ = auVar102._20_4_ * fVar159;
  auVar99._24_4_ = auVar102._24_4_ * fVar161;
  auVar99._28_4_ = auVar93._28_4_;
  auVar5 = vfmadd231ps_fma(auVar88,auVar92,auVar95);
  auVar81 = vfmadd231ps_fma(auVar104,auVar92,auVar98);
  auVar85 = vfmadd231ps_fma(auVar99,auVar92,auVar101);
  auVar5 = vfmadd231ps_fma(ZEXT1632(auVar5),auVar109,auVar94);
  auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar109,auVar97);
  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar109,auVar100);
  auVar94 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar251 = ZEXT3264(auVar94);
  vandps_avx512vl(ZEXT1632(auVar83),auVar94);
  auVar106._8_4_ = 0x219392ef;
  auVar106._0_8_ = 0x219392ef219392ef;
  auVar106._12_4_ = 0x219392ef;
  auVar106._16_4_ = 0x219392ef;
  auVar106._20_4_ = 0x219392ef;
  auVar106._24_4_ = 0x219392ef;
  auVar106._28_4_ = 0x219392ef;
  uVar79 = vcmpps_avx512vl(auVar94,auVar106,1);
  bVar78 = (bool)((byte)uVar79 & 1);
  auVar89._0_4_ = (uint)bVar78 * 0x219392ef | (uint)!bVar78 * auVar83._0_4_;
  bVar78 = (bool)((byte)(uVar79 >> 1) & 1);
  auVar89._4_4_ = (uint)bVar78 * 0x219392ef | (uint)!bVar78 * auVar83._4_4_;
  bVar78 = (bool)((byte)(uVar79 >> 2) & 1);
  auVar89._8_4_ = (uint)bVar78 * 0x219392ef | (uint)!bVar78 * auVar83._8_4_;
  bVar78 = (bool)((byte)(uVar79 >> 3) & 1);
  auVar89._12_4_ = (uint)bVar78 * 0x219392ef | (uint)!bVar78 * auVar83._12_4_;
  auVar89._16_4_ = (uint)((byte)(uVar79 >> 4) & 1) * 0x219392ef;
  auVar89._20_4_ = (uint)((byte)(uVar79 >> 5) & 1) * 0x219392ef;
  auVar89._24_4_ = (uint)((byte)(uVar79 >> 6) & 1) * 0x219392ef;
  auVar89._28_4_ = (uint)(byte)(uVar79 >> 7) * 0x219392ef;
  vandps_avx512vl(ZEXT1632(auVar84),auVar94);
  uVar79 = vcmpps_avx512vl(auVar89,auVar106,1);
  bVar78 = (bool)((byte)uVar79 & 1);
  auVar90._0_4_ = (uint)bVar78 * 0x219392ef | (uint)!bVar78 * auVar84._0_4_;
  bVar78 = (bool)((byte)(uVar79 >> 1) & 1);
  auVar90._4_4_ = (uint)bVar78 * 0x219392ef | (uint)!bVar78 * auVar84._4_4_;
  bVar78 = (bool)((byte)(uVar79 >> 2) & 1);
  auVar90._8_4_ = (uint)bVar78 * 0x219392ef | (uint)!bVar78 * auVar84._8_4_;
  bVar78 = (bool)((byte)(uVar79 >> 3) & 1);
  auVar90._12_4_ = (uint)bVar78 * 0x219392ef | (uint)!bVar78 * auVar84._12_4_;
  auVar90._16_4_ = (uint)((byte)(uVar79 >> 4) & 1) * 0x219392ef;
  auVar90._20_4_ = (uint)((byte)(uVar79 >> 5) & 1) * 0x219392ef;
  auVar90._24_4_ = (uint)((byte)(uVar79 >> 6) & 1) * 0x219392ef;
  auVar90._28_4_ = (uint)(byte)(uVar79 >> 7) * 0x219392ef;
  vandps_avx512vl(ZEXT1632(auVar4),auVar94);
  uVar79 = vcmpps_avx512vl(auVar90,auVar106,1);
  bVar78 = (bool)((byte)uVar79 & 1);
  auVar94._0_4_ = (uint)bVar78 * 0x219392ef | (uint)!bVar78 * auVar4._0_4_;
  bVar78 = (bool)((byte)(uVar79 >> 1) & 1);
  auVar94._4_4_ = (uint)bVar78 * 0x219392ef | (uint)!bVar78 * auVar4._4_4_;
  bVar78 = (bool)((byte)(uVar79 >> 2) & 1);
  auVar94._8_4_ = (uint)bVar78 * 0x219392ef | (uint)!bVar78 * auVar4._8_4_;
  bVar78 = (bool)((byte)(uVar79 >> 3) & 1);
  auVar94._12_4_ = (uint)bVar78 * 0x219392ef | (uint)!bVar78 * auVar4._12_4_;
  auVar94._16_4_ = (uint)((byte)(uVar79 >> 4) & 1) * 0x219392ef;
  auVar94._20_4_ = (uint)((byte)(uVar79 >> 5) & 1) * 0x219392ef;
  auVar94._24_4_ = (uint)((byte)(uVar79 >> 6) & 1) * 0x219392ef;
  auVar94._28_4_ = (uint)(byte)(uVar79 >> 7) * 0x219392ef;
  auVar95 = vrcp14ps_avx512vl(auVar89);
  auVar107._8_4_ = 0x3f800000;
  auVar107._0_8_ = &DAT_3f8000003f800000;
  auVar107._12_4_ = 0x3f800000;
  auVar107._16_4_ = 0x3f800000;
  auVar107._20_4_ = 0x3f800000;
  auVar107._24_4_ = 0x3f800000;
  auVar107._28_4_ = 0x3f800000;
  auVar83 = vfnmadd213ps_fma(auVar89,auVar95,auVar107);
  auVar83 = vfmadd132ps_fma(ZEXT1632(auVar83),auVar95,auVar95);
  auVar95 = vrcp14ps_avx512vl(auVar90);
  auVar84 = vfnmadd213ps_fma(auVar90,auVar95,auVar107);
  auVar84 = vfmadd132ps_fma(ZEXT1632(auVar84),auVar95,auVar95);
  auVar95 = vrcp14ps_avx512vl(auVar94);
  auVar4 = vfnmadd213ps_fma(auVar94,auVar95,auVar107);
  auVar4 = vfmadd132ps_fma(ZEXT1632(auVar4),auVar95,auVar95);
  auVar94 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar71 * 7 + 6));
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar94 = vsubps_avx(auVar94,ZEXT1632(auVar5));
  auVar95 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar71 * 9 + 6));
  auVar100._4_4_ = auVar83._4_4_ * auVar94._4_4_;
  auVar100._0_4_ = auVar83._0_4_ * auVar94._0_4_;
  auVar100._8_4_ = auVar83._8_4_ * auVar94._8_4_;
  auVar100._12_4_ = auVar83._12_4_ * auVar94._12_4_;
  auVar100._16_4_ = auVar94._16_4_ * 0.0;
  auVar100._20_4_ = auVar94._20_4_ * 0.0;
  auVar100._24_4_ = auVar94._24_4_ * 0.0;
  auVar100._28_4_ = auVar94._28_4_;
  auVar94 = vcvtdq2ps_avx(auVar95);
  auVar94 = vsubps_avx(auVar94,ZEXT1632(auVar5));
  auVar105._0_4_ = auVar83._0_4_ * auVar94._0_4_;
  auVar105._4_4_ = auVar83._4_4_ * auVar94._4_4_;
  auVar105._8_4_ = auVar83._8_4_ * auVar94._8_4_;
  auVar105._12_4_ = auVar83._12_4_ * auVar94._12_4_;
  auVar105._16_4_ = auVar94._16_4_ * 0.0;
  auVar105._20_4_ = auVar94._20_4_ * 0.0;
  auVar105._24_4_ = auVar94._24_4_ * 0.0;
  auVar105._28_4_ = 0;
  auVar95 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar7 * 0x10 + 6));
  auVar94 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar7 * 0x10 + uVar71 * -2 + 6));
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar94 = vsubps_avx(auVar94,ZEXT1632(auVar81));
  auVar101._4_4_ = auVar84._4_4_ * auVar94._4_4_;
  auVar101._0_4_ = auVar84._0_4_ * auVar94._0_4_;
  auVar101._8_4_ = auVar84._8_4_ * auVar94._8_4_;
  auVar101._12_4_ = auVar84._12_4_ * auVar94._12_4_;
  auVar101._16_4_ = auVar94._16_4_ * 0.0;
  auVar101._20_4_ = auVar94._20_4_ * 0.0;
  auVar101._24_4_ = auVar94._24_4_ * 0.0;
  auVar101._28_4_ = auVar94._28_4_;
  auVar94 = vcvtdq2ps_avx(auVar95);
  auVar94 = vsubps_avx(auVar94,ZEXT1632(auVar81));
  auVar103._0_4_ = auVar84._0_4_ * auVar94._0_4_;
  auVar103._4_4_ = auVar84._4_4_ * auVar94._4_4_;
  auVar103._8_4_ = auVar84._8_4_ * auVar94._8_4_;
  auVar103._12_4_ = auVar84._12_4_ * auVar94._12_4_;
  auVar103._16_4_ = auVar94._16_4_ * 0.0;
  auVar103._20_4_ = auVar94._20_4_ * 0.0;
  auVar103._24_4_ = auVar94._24_4_ * 0.0;
  auVar103._28_4_ = 0;
  auVar94 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar72 + uVar71 + 6));
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar94 = vsubps_avx(auVar94,ZEXT1632(auVar85));
  auVar102._4_4_ = auVar94._4_4_ * auVar4._4_4_;
  auVar102._0_4_ = auVar94._0_4_ * auVar4._0_4_;
  auVar102._8_4_ = auVar94._8_4_ * auVar4._8_4_;
  auVar102._12_4_ = auVar94._12_4_ * auVar4._12_4_;
  auVar102._16_4_ = auVar94._16_4_ * 0.0;
  auVar102._20_4_ = auVar94._20_4_ * 0.0;
  auVar102._24_4_ = auVar94._24_4_ * 0.0;
  auVar102._28_4_ = auVar94._28_4_;
  auVar94 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar71 * 0x17 + 6));
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar94 = vsubps_avx(auVar94,ZEXT1632(auVar85));
  auVar91._0_4_ = auVar4._0_4_ * auVar94._0_4_;
  auVar91._4_4_ = auVar4._4_4_ * auVar94._4_4_;
  auVar91._8_4_ = auVar4._8_4_ * auVar94._8_4_;
  auVar91._12_4_ = auVar4._12_4_ * auVar94._12_4_;
  auVar91._16_4_ = auVar94._16_4_ * 0.0;
  auVar91._20_4_ = auVar94._20_4_ * 0.0;
  auVar91._24_4_ = auVar94._24_4_ * 0.0;
  auVar91._28_4_ = 0;
  auVar94 = vpminsd_avx2(auVar100,auVar105);
  auVar95 = vpminsd_avx2(auVar101,auVar103);
  auVar94 = vmaxps_avx(auVar94,auVar95);
  auVar95 = vpminsd_avx2(auVar102,auVar91);
  uVar1 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar96._4_4_ = uVar1;
  auVar96._0_4_ = uVar1;
  auVar96._8_4_ = uVar1;
  auVar96._12_4_ = uVar1;
  auVar96._16_4_ = uVar1;
  auVar96._20_4_ = uVar1;
  auVar96._24_4_ = uVar1;
  auVar96._28_4_ = uVar1;
  auVar95 = vmaxps_avx512vl(auVar95,auVar96);
  auVar94 = vmaxps_avx(auVar94,auVar95);
  auVar95._8_4_ = 0x3f7ffffa;
  auVar95._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar95._12_4_ = 0x3f7ffffa;
  auVar95._16_4_ = 0x3f7ffffa;
  auVar95._20_4_ = 0x3f7ffffa;
  auVar95._24_4_ = 0x3f7ffffa;
  auVar95._28_4_ = 0x3f7ffffa;
  local_3c0 = vmulps_avx512vl(auVar94,auVar95);
  auVar94 = vpmaxsd_avx2(auVar100,auVar105);
  auVar95 = vpmaxsd_avx2(auVar101,auVar103);
  auVar94 = vminps_avx(auVar94,auVar95);
  auVar95 = vpmaxsd_avx2(auVar102,auVar91);
  fVar226 = ray->tfar;
  auVar97._4_4_ = fVar226;
  auVar97._0_4_ = fVar226;
  auVar97._8_4_ = fVar226;
  auVar97._12_4_ = fVar226;
  auVar97._16_4_ = fVar226;
  auVar97._20_4_ = fVar226;
  auVar97._24_4_ = fVar226;
  auVar97._28_4_ = fVar226;
  auVar95 = vminps_avx512vl(auVar95,auVar97);
  auVar94 = vminps_avx(auVar94,auVar95);
  auVar98._8_4_ = 0x3f800003;
  auVar98._0_8_ = 0x3f8000033f800003;
  auVar98._12_4_ = 0x3f800003;
  auVar98._16_4_ = 0x3f800003;
  auVar98._20_4_ = 0x3f800003;
  auVar98._24_4_ = 0x3f800003;
  auVar98._28_4_ = 0x3f800003;
  auVar94 = vmulps_avx512vl(auVar94,auVar98);
  auVar95 = vpbroadcastd_avx512vl();
  uVar18 = vpcmpgtd_avx512vl(auVar95,_DAT_0205a920);
  uVar17 = vcmpps_avx512vl(local_3c0,auVar94,2);
  bVar77 = (byte)((byte)uVar17 & (byte)uVar18) == 0;
  bVar78 = !bVar77;
  if (bVar77) {
    return bVar78;
  }
  local_750 = (ulong)(byte)((byte)uVar17 & (byte)uVar18);
  pPVar74 = prim + lVar76 + 0x16;
  local_8c8 = context;
  local_760 = pPVar74;
  local_758 = prim;
LAB_01d3ab9a:
  lVar76 = 0;
  for (uVar79 = local_750; (uVar79 & 1) == 0; uVar79 = uVar79 >> 1 | 0x8000000000000000) {
    lVar76 = lVar76 + 1;
  }
  local_750 = local_750 - 1 & local_750;
  uVar1 = *(undefined4 *)(prim + lVar76 * 4 + 6);
  uVar79 = (ulong)(uint)((int)lVar76 << 6);
  auVar83 = *(undefined1 (*) [16])(pPVar74 + uVar79);
  if (local_750 != 0) {
    uVar72 = local_750 - 1 & local_750;
    for (uVar71 = local_750; (uVar71 & 1) == 0; uVar71 = uVar71 >> 1 | 0x8000000000000000) {
    }
    if (uVar72 != 0) {
      for (; (uVar72 & 1) == 0; uVar72 = uVar72 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar84 = *(undefined1 (*) [16])(pPVar74 + uVar79 + 0x10);
  auVar4 = *(undefined1 (*) [16])(pPVar74 + uVar79 + 0x20);
  auVar5 = *(undefined1 (*) [16])(pPVar74 + uVar79 + 0x30);
  auVar223._0_4_ = auVar83._0_4_ + auVar84._0_4_ + auVar4._0_4_ + auVar5._0_4_;
  auVar223._4_4_ = auVar83._4_4_ + auVar84._4_4_ + auVar4._4_4_ + auVar5._4_4_;
  auVar223._8_4_ = auVar83._8_4_ + auVar84._8_4_ + auVar4._8_4_ + auVar5._8_4_;
  auVar223._12_4_ = auVar83._12_4_ + auVar84._12_4_ + auVar4._12_4_ + auVar5._12_4_;
  aVar2 = (ray->org).field_0;
  aVar3 = (ray->dir).field_0.field_1;
  auVar87._8_4_ = 0x3e800000;
  auVar87._0_8_ = 0x3e8000003e800000;
  auVar87._12_4_ = 0x3e800000;
  auVar81 = vmulps_avx512vl(auVar223,auVar87);
  auVar81 = vsubps_avx(auVar81,(undefined1  [16])aVar2);
  auVar81 = vdpps_avx(auVar81,(undefined1  [16])aVar3,0x7f);
  local_868 = (ulong)*(uint *)(prim + 2);
  auVar85 = vdpps_avx((undefined1  [16])aVar3,(undefined1  [16])aVar3,0x7f);
  auVar231._4_12_ = ZEXT812(0) << 0x20;
  auVar231._0_4_ = auVar85._0_4_;
  auVar82 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar231);
  auVar85 = vfnmadd213ss_fma(auVar82,auVar85,ZEXT416(0x40000000));
  fVar226 = auVar81._0_4_ * auVar82._0_4_ * auVar85._0_4_;
  local_610 = ZEXT416((uint)fVar226);
  auVar224._4_4_ = fVar226;
  auVar224._0_4_ = fVar226;
  auVar224._8_4_ = fVar226;
  auVar224._12_4_ = fVar226;
  fStack_730 = fVar226;
  _local_740 = auVar224;
  fStack_72c = fVar226;
  fStack_728 = fVar226;
  fStack_724 = fVar226;
  auVar81 = vfmadd231ps_fma((undefined1  [16])aVar2,(undefined1  [16])aVar3,auVar224);
  auVar81 = vblendps_avx(auVar81,ZEXT816(0) << 0x40,8);
  auVar83 = vsubps_avx(auVar83,auVar81);
  auVar4 = vsubps_avx(auVar4,auVar81);
  uVar230 = *(undefined4 *)&(ray->dir).field_0;
  local_480._4_4_ = uVar230;
  local_480._0_4_ = uVar230;
  local_480._8_4_ = uVar230;
  local_480._12_4_ = uVar230;
  local_480._16_4_ = uVar230;
  local_480._20_4_ = uVar230;
  local_480._24_4_ = uVar230;
  local_480._28_4_ = uVar230;
  auVar233 = ZEXT3264(local_480);
  uVar230 = *(undefined4 *)((long)&(ray->dir).field_0 + 4);
  local_4a0._4_4_ = uVar230;
  local_4a0._0_4_ = uVar230;
  local_4a0._8_4_ = uVar230;
  local_4a0._12_4_ = uVar230;
  local_4a0._16_4_ = uVar230;
  local_4a0._20_4_ = uVar230;
  local_4a0._24_4_ = uVar230;
  local_4a0._28_4_ = uVar230;
  auVar241 = ZEXT3264(local_4a0);
  local_4c0 = *(undefined4 *)((long)&(ray->dir).field_0 + 8);
  uStack_4bc = local_4c0;
  uStack_4b8 = local_4c0;
  uStack_4b4 = local_4c0;
  uStack_4b0 = local_4c0;
  uStack_4ac = local_4c0;
  uStack_4a8 = local_4c0;
  uStack_4a4 = local_4c0;
  auVar84 = vsubps_avx(auVar84,auVar81);
  auVar232 = ZEXT1664(auVar84);
  auVar5 = vsubps_avx(auVar5,auVar81);
  local_1e0 = vbroadcastss_avx512vl(auVar83);
  auVar110._8_4_ = 1;
  auVar110._0_8_ = 0x100000001;
  auVar110._12_4_ = 1;
  auVar110._16_4_ = 1;
  auVar110._20_4_ = 1;
  auVar110._24_4_ = 1;
  auVar110._28_4_ = 1;
  local_680 = ZEXT1632(auVar83);
  local_200 = vpermps_avx512vl(auVar110,local_680);
  auVar113._8_4_ = 2;
  auVar113._0_8_ = 0x200000002;
  auVar113._12_4_ = 2;
  auVar113._16_4_ = 2;
  auVar113._20_4_ = 2;
  auVar113._24_4_ = 2;
  auVar113._28_4_ = 2;
  local_220 = vpermps_avx512vl(auVar113,local_680);
  auVar111._8_4_ = 3;
  auVar111._0_8_ = 0x300000003;
  auVar111._12_4_ = 3;
  auVar111._16_4_ = 3;
  auVar111._20_4_ = 3;
  auVar111._24_4_ = 3;
  auVar111._28_4_ = 3;
  local_1a0 = vpermps_avx2(auVar111,local_680);
  auVar225 = ZEXT3264(local_1a0);
  local_240 = vbroadcastss_avx512vl(auVar84);
  local_6c0 = ZEXT1632(auVar84);
  local_260 = vpermps_avx512vl(auVar110,local_6c0);
  local_280 = vpermps_avx512vl(auVar113,local_6c0);
  local_2a0 = vpermps_avx512vl(auVar111,local_6c0);
  local_2c0 = vbroadcastss_avx512vl(auVar4);
  local_6a0 = ZEXT1632(auVar4);
  local_2e0 = vpermps_avx512vl(auVar110,local_6a0);
  local_300 = vpermps_avx512vl(auVar113,local_6a0);
  local_320 = vpermps_avx512vl(auVar111,local_6a0);
  local_340 = vbroadcastss_avx512vl(auVar5);
  _local_6e0 = ZEXT1632(auVar5);
  local_360 = vpermps_avx512vl(auVar110,_local_6e0);
  local_380 = vpermps_avx2(auVar113,_local_6e0);
  local_4e0 = vpermps_avx512vl(auVar111,_local_6e0);
  auVar94 = vpermps_avx2(auVar113,ZEXT1632(CONCAT412(aVar3.field_3.w * aVar3.field_3.w,
                                                     CONCAT48(aVar3.z * aVar3.z,
                                                              CONCAT44(aVar3.y * aVar3.y,
                                                                       aVar3.x * aVar3.x)))));
  auVar83 = vfmadd231ps_fma(auVar94,local_4a0,local_4a0);
  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),local_480,local_480);
  vandps_avx512vl(ZEXT1632(auVar83),auVar251._0_32_);
  local_808 = 1;
  local_748 = 0;
  bVar75 = 0;
  local_630 = ZEXT816(0x3f80000000000000);
  auVar213 = ZEXT3264(CONCAT428(0x3f800000,
                                CONCAT424(0x3f800000,
                                          CONCAT420(0x3f800000,
                                                    CONCAT416(0x3f800000,
                                                              CONCAT412(0x3f800000,
                                                                        CONCAT48(0x3f800000,
                                                                                 &
                                                  DAT_3f8000003f800000)))))));
  local_1c0 = ZEXT1632(auVar83);
  local_3a0 = local_4e0;
  do {
    auVar83 = vmovshdup_avx(local_630);
    fVar226 = local_630._0_4_;
    fVar245 = auVar83._0_4_ - fVar226;
    fVar240 = fVar245 * 0.04761905;
    local_8c0._4_4_ = fVar226;
    local_8c0._0_4_ = fVar226;
    local_8c0._8_4_ = fVar226;
    local_8c0._12_4_ = fVar226;
    local_8c0._16_4_ = fVar226;
    local_8c0._20_4_ = fVar226;
    local_8c0._24_4_ = fVar226;
    local_8c0._28_4_ = fVar226;
    local_700._4_4_ = fVar245;
    local_700._0_4_ = fVar245;
    local_700._8_4_ = fVar245;
    local_700._12_4_ = fVar245;
    local_700._16_4_ = fVar245;
    local_700._20_4_ = fVar245;
    local_700._24_4_ = fVar245;
    local_700._28_4_ = fVar245;
    auVar83 = vfmadd231ps_fma(local_8c0,local_700,_DAT_02020f20);
    auVar113 = auVar213._0_32_;
    auVar94 = vsubps_avx(auVar113,ZEXT1632(auVar83));
    fVar181 = auVar94._0_4_;
    fVar236 = auVar94._4_4_;
    fVar159 = auVar94._8_4_;
    fVar163 = auVar94._12_4_;
    fVar235 = auVar94._16_4_;
    fVar237 = auVar94._20_4_;
    fVar239 = auVar94._24_4_;
    fVar140 = fVar181 * fVar181 * fVar181;
    fVar156 = fVar236 * fVar236 * fVar236;
    auVar34._4_4_ = fVar156;
    auVar34._0_4_ = fVar140;
    fVar157 = fVar159 * fVar159 * fVar159;
    auVar34._8_4_ = fVar157;
    fVar158 = fVar163 * fVar163 * fVar163;
    auVar34._12_4_ = fVar158;
    fVar160 = fVar235 * fVar235 * fVar235;
    auVar34._16_4_ = fVar160;
    fVar162 = fVar237 * fVar237 * fVar237;
    auVar34._20_4_ = fVar162;
    fVar164 = fVar239 * fVar239 * fVar239;
    auVar34._24_4_ = fVar164;
    auVar34._28_4_ = fVar245;
    auVar95 = vbroadcastss_avx512vl(ZEXT416(0x40800000));
    auVar96 = vmulps_avx512vl(auVar34,auVar95);
    fVar234 = auVar83._0_4_;
    fVar238 = auVar83._4_4_;
    fVar161 = auVar83._8_4_;
    fVar203 = auVar83._12_4_;
    fVar182 = fVar234 * fVar234 * fVar234;
    fVar200 = fVar238 * fVar238 * fVar238;
    fVar201 = fVar161 * fVar161 * fVar161;
    fVar202 = fVar203 * fVar203 * fVar203;
    auVar242._0_4_ = fVar234 * fVar181;
    auVar242._4_4_ = fVar238 * fVar236;
    auVar242._8_4_ = fVar161 * fVar159;
    auVar242._12_4_ = fVar203 * fVar163;
    auVar242._16_4_ = fVar235 * 0.0;
    auVar242._20_4_ = fVar237 * 0.0;
    auVar242._28_36_ = auVar241._28_36_;
    auVar242._24_4_ = fVar239 * 0.0;
    fVar226 = auVar250._28_4_;
    auVar95 = vmulps_avx512vl(ZEXT1632(CONCAT412(fVar202,CONCAT48(fVar201,CONCAT44(fVar200,fVar182))
                                                )),auVar95);
    fVar245 = auVar95._28_4_ + fVar245;
    auVar35._4_4_ = fVar156 * 0.16666667;
    auVar35._0_4_ = fVar140 * 0.16666667;
    auVar35._8_4_ = fVar157 * 0.16666667;
    auVar35._12_4_ = fVar158 * 0.16666667;
    auVar35._16_4_ = fVar160 * 0.16666667;
    auVar35._20_4_ = fVar162 * 0.16666667;
    auVar35._24_4_ = fVar164 * 0.16666667;
    auVar35._28_4_ = fVar245;
    auVar36._4_4_ =
         (auVar242._4_4_ * fVar236 * 12.0 + auVar242._4_4_ * fVar238 * 6.0 + fVar200 + auVar96._4_4_
         ) * 0.16666667;
    auVar36._0_4_ =
         (auVar242._0_4_ * fVar181 * 12.0 + auVar242._0_4_ * fVar234 * 6.0 + fVar182 + auVar96._0_4_
         ) * 0.16666667;
    auVar36._8_4_ =
         (auVar242._8_4_ * fVar159 * 12.0 + auVar242._8_4_ * fVar161 * 6.0 + fVar201 + auVar96._8_4_
         ) * 0.16666667;
    auVar36._12_4_ =
         (auVar242._12_4_ * fVar163 * 12.0 + auVar242._12_4_ * fVar203 * 6.0 +
         fVar202 + auVar96._12_4_) * 0.16666667;
    auVar36._16_4_ =
         (auVar242._16_4_ * fVar235 * 12.0 + auVar242._16_4_ * 0.0 * 6.0 + auVar96._16_4_ + 0.0) *
         0.16666667;
    auVar36._20_4_ =
         (auVar242._20_4_ * fVar237 * 12.0 + auVar242._20_4_ * 0.0 * 6.0 + auVar96._20_4_ + 0.0) *
         0.16666667;
    auVar36._24_4_ =
         (auVar242._24_4_ * fVar239 * 12.0 + auVar242._24_4_ * 0.0 * 6.0 + auVar96._24_4_ + 0.0) *
         0.16666667;
    auVar36._28_4_ = auVar248._28_4_;
    auVar37._4_4_ =
         (auVar95._4_4_ + fVar156 + auVar242._4_4_ * fVar238 * 12.0 + auVar242._4_4_ * fVar236 * 6.0
         ) * 0.16666667;
    auVar37._0_4_ =
         (auVar95._0_4_ + fVar140 + auVar242._0_4_ * fVar234 * 12.0 + auVar242._0_4_ * fVar181 * 6.0
         ) * 0.16666667;
    auVar37._8_4_ =
         (auVar95._8_4_ + fVar157 + auVar242._8_4_ * fVar161 * 12.0 + auVar242._8_4_ * fVar159 * 6.0
         ) * 0.16666667;
    auVar37._12_4_ =
         (auVar95._12_4_ + fVar158 +
         auVar242._12_4_ * fVar203 * 12.0 + auVar242._12_4_ * fVar163 * 6.0) * 0.16666667;
    auVar37._16_4_ =
         (auVar95._16_4_ + fVar160 + auVar242._16_4_ * 0.0 * 12.0 + auVar242._16_4_ * fVar235 * 6.0)
         * 0.16666667;
    auVar37._20_4_ =
         (auVar95._20_4_ + fVar162 + auVar242._20_4_ * 0.0 * 12.0 + auVar242._20_4_ * fVar237 * 6.0)
         * 0.16666667;
    auVar37._24_4_ =
         (auVar95._24_4_ + fVar164 + auVar242._24_4_ * 0.0 * 12.0 + auVar242._24_4_ * fVar239 * 6.0)
         * 0.16666667;
    auVar37._28_4_ = fVar226;
    auVar38._28_4_ = fVar245 + auVar248._28_4_ + auVar225._28_4_;
    auVar38._0_28_ =
         ZEXT1628(CONCAT412(fVar202 * 0.16666667,
                            CONCAT48(fVar201 * 0.16666667,
                                     CONCAT44(fVar200 * 0.16666667,fVar182 * 0.16666667))));
    auVar95 = vmulps_avx512vl(local_340,auVar38);
    auVar97 = vmulps_avx512vl(local_360,auVar38);
    auVar39._4_4_ = local_380._4_4_ * fVar200 * 0.16666667;
    auVar39._0_4_ = local_380._0_4_ * fVar182 * 0.16666667;
    auVar39._8_4_ = local_380._8_4_ * fVar201 * 0.16666667;
    auVar39._12_4_ = local_380._12_4_ * fVar202 * 0.16666667;
    auVar39._16_4_ = local_380._16_4_ * 0.0;
    auVar39._20_4_ = local_380._20_4_ * 0.0;
    auVar39._24_4_ = local_380._24_4_ * 0.0;
    auVar39._28_4_ = auVar244._28_4_ + fVar226 + auVar96._28_4_ + 0.0;
    auVar96 = vmulps_avx512vl(local_3a0,auVar38);
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar37,local_2c0);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar37,local_2e0);
    auVar98 = vfmadd231ps_avx512vl(auVar39,auVar37,local_300);
    auVar96 = vfmadd231ps_avx512vl(auVar96,local_320,auVar37);
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar36,local_240);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar36,local_260);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar36,local_280);
    auVar96 = vfmadd231ps_avx512vl(auVar96,local_2a0,auVar36);
    auVar99 = vfmadd231ps_avx512vl(auVar95,auVar35,local_1e0);
    local_860 = vfmadd231ps_avx512vl(auVar97,auVar35,local_200);
    local_720 = vfmadd231ps_avx512vl(auVar98,auVar35,local_220);
    auVar84 = vfmadd231ps_fma(auVar96,local_1a0,auVar35);
    auVar98 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar96 = vxorps_avx512vl(auVar94,auVar98);
    auVar97 = vxorps_avx512vl(ZEXT1632(auVar83),auVar98);
    auVar218._0_4_ = auVar97._0_4_ * fVar234;
    auVar218._4_4_ = auVar97._4_4_ * fVar238;
    auVar218._8_4_ = auVar97._8_4_ * fVar161;
    auVar218._12_4_ = auVar97._12_4_ * fVar203;
    auVar218._16_4_ = auVar97._16_4_ * 0.0;
    auVar218._20_4_ = auVar97._20_4_ * 0.0;
    auVar218._24_4_ = auVar97._24_4_ * 0.0;
    auVar218._28_4_ = 0;
    auVar112._8_4_ = 0x40800000;
    auVar112._0_8_ = 0x4080000040800000;
    auVar112._12_4_ = 0x40800000;
    auVar112._16_4_ = 0x40800000;
    auVar112._20_4_ = 0x40800000;
    auVar112._24_4_ = 0x40800000;
    auVar112._28_4_ = 0x40800000;
    auVar100 = vmulps_avx512vl(auVar242._0_32_,auVar112);
    auVar95 = vsubps_avx(auVar218,auVar100);
    auVar40._4_4_ = auVar96._4_4_ * fVar236 * 0.5;
    auVar40._0_4_ = auVar96._0_4_ * fVar181 * 0.5;
    auVar40._8_4_ = auVar96._8_4_ * fVar159 * 0.5;
    auVar40._12_4_ = auVar96._12_4_ * fVar163 * 0.5;
    auVar40._16_4_ = auVar96._16_4_ * fVar235 * 0.5;
    auVar40._20_4_ = auVar96._20_4_ * fVar237 * 0.5;
    auVar40._24_4_ = auVar96._24_4_ * fVar239 * 0.5;
    auVar40._28_4_ = auVar94._28_4_;
    auVar41._4_4_ = auVar95._4_4_ * 0.5;
    auVar41._0_4_ = auVar95._0_4_ * 0.5;
    auVar41._8_4_ = auVar95._8_4_ * 0.5;
    auVar41._12_4_ = auVar95._12_4_ * 0.5;
    auVar41._16_4_ = auVar95._16_4_ * 0.5;
    auVar41._20_4_ = auVar95._20_4_ * 0.5;
    auVar41._24_4_ = auVar95._24_4_ * 0.5;
    auVar41._28_4_ = auVar95._28_4_;
    auVar42._4_4_ = (fVar236 * fVar236 + auVar100._4_4_) * 0.5;
    auVar42._0_4_ = (fVar181 * fVar181 + auVar100._0_4_) * 0.5;
    auVar42._8_4_ = (fVar159 * fVar159 + auVar100._8_4_) * 0.5;
    auVar42._12_4_ = (fVar163 * fVar163 + auVar100._12_4_) * 0.5;
    auVar42._16_4_ = (fVar235 * fVar235 + auVar100._16_4_) * 0.5;
    auVar42._20_4_ = (fVar237 * fVar237 + auVar100._20_4_) * 0.5;
    auVar42._24_4_ = (fVar239 * fVar239 + auVar100._24_4_) * 0.5;
    auVar42._28_4_ = auVar232._28_4_ + auVar100._28_4_;
    fVar181 = fVar234 * fVar234 * 0.5;
    fVar234 = fVar238 * fVar238 * 0.5;
    fVar236 = fVar161 * fVar161 * 0.5;
    fVar238 = fVar203 * fVar203 * 0.5;
    auVar43._28_4_ = auVar233._28_4_;
    auVar43._0_28_ = ZEXT1628(CONCAT412(fVar238,CONCAT48(fVar236,CONCAT44(fVar234,fVar181))));
    auVar94 = vmulps_avx512vl(local_340,auVar43);
    auVar95 = vmulps_avx512vl(local_360,auVar43);
    auVar44._4_4_ = fVar234 * local_380._4_4_;
    auVar44._0_4_ = fVar181 * local_380._0_4_;
    auVar44._8_4_ = fVar236 * local_380._8_4_;
    auVar44._12_4_ = fVar238 * local_380._12_4_;
    auVar44._16_4_ = local_380._16_4_ * 0.0;
    auVar44._20_4_ = local_380._20_4_ * 0.0;
    auVar44._24_4_ = local_380._24_4_ * 0.0;
    auVar44._28_4_ = fVar226;
    auVar96 = vmulps_avx512vl(local_3a0,auVar43);
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar42,local_2c0);
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar42,local_2e0);
    auVar100 = vfmadd231ps_avx512vl(auVar44,auVar42,local_300);
    auVar96 = vfmadd231ps_avx512vl(auVar96,local_320,auVar42);
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar41,local_240);
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar41,local_260);
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar41,local_280);
    auVar96 = vfmadd231ps_avx512vl(auVar96,local_2a0,auVar41);
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar40,local_1e0);
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar40,local_200);
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar40,local_220);
    auVar83 = vfmadd231ps_fma(auVar96,local_1a0,auVar40);
    auVar45._4_4_ = auVar94._4_4_ * fVar240;
    auVar45._0_4_ = auVar94._0_4_ * fVar240;
    auVar45._8_4_ = auVar94._8_4_ * fVar240;
    auVar45._12_4_ = auVar94._12_4_ * fVar240;
    auVar45._16_4_ = auVar94._16_4_ * fVar240;
    auVar45._20_4_ = auVar94._20_4_ * fVar240;
    auVar45._24_4_ = auVar94._24_4_ * fVar240;
    auVar45._28_4_ = auVar97._28_4_;
    auVar244 = ZEXT3264(auVar45);
    auVar46._4_4_ = auVar95._4_4_ * fVar240;
    auVar46._0_4_ = auVar95._0_4_ * fVar240;
    auVar46._8_4_ = auVar95._8_4_ * fVar240;
    auVar46._12_4_ = auVar95._12_4_ * fVar240;
    auVar46._16_4_ = auVar95._16_4_ * fVar240;
    auVar46._20_4_ = auVar95._20_4_ * fVar240;
    auVar46._24_4_ = auVar95._24_4_ * fVar240;
    auVar46._28_4_ = auVar95._28_4_;
    auVar248 = ZEXT3264(auVar46);
    auVar47._4_4_ = auVar100._4_4_ * fVar240;
    auVar47._0_4_ = auVar100._0_4_ * fVar240;
    auVar47._8_4_ = auVar100._8_4_ * fVar240;
    auVar47._12_4_ = auVar100._12_4_ * fVar240;
    auVar47._16_4_ = auVar100._16_4_ * fVar240;
    auVar47._20_4_ = auVar100._20_4_ * fVar240;
    auVar47._24_4_ = auVar100._24_4_ * fVar240;
    auVar47._28_4_ = auVar100._28_4_;
    auVar250 = ZEXT3264(auVar47);
    fVar226 = auVar83._0_4_ * fVar240;
    fVar181 = auVar83._4_4_ * fVar240;
    auVar48._4_4_ = fVar181;
    auVar48._0_4_ = fVar226;
    fVar234 = auVar83._8_4_ * fVar240;
    auVar48._8_4_ = fVar234;
    fVar236 = auVar83._12_4_ * fVar240;
    auVar48._12_4_ = fVar236;
    auVar48._16_4_ = fVar240 * 0.0;
    auVar48._20_4_ = fVar240 * 0.0;
    auVar48._24_4_ = fVar240 * 0.0;
    auVar48._28_4_ = local_380._28_4_;
    auVar83 = vxorps_avx512vl(local_340._0_16_,local_340._0_16_);
    auVar100 = vpermt2ps_avx512vl(auVar99,_DAT_0205fd20,ZEXT1632(auVar83));
    auVar232 = ZEXT3264(auVar100);
    auVar101 = vpermt2ps_avx512vl(local_860,_DAT_0205fd20,ZEXT1632(auVar83));
    auVar233 = ZEXT3264(auVar101);
    auVar96 = ZEXT1632(auVar83);
    auVar102 = vpermt2ps_avx512vl(local_720,_DAT_0205fd20,auVar96);
    auVar241 = ZEXT3264(auVar102);
    auVar219._0_4_ = fVar226 + auVar84._0_4_;
    auVar219._4_4_ = fVar181 + auVar84._4_4_;
    auVar219._8_4_ = fVar234 + auVar84._8_4_;
    auVar219._12_4_ = fVar236 + auVar84._12_4_;
    auVar219._16_4_ = fVar240 * 0.0 + 0.0;
    auVar219._20_4_ = fVar240 * 0.0 + 0.0;
    auVar219._24_4_ = fVar240 * 0.0 + 0.0;
    auVar219._28_4_ = local_380._28_4_ + 0.0;
    auVar94 = vmaxps_avx(ZEXT1632(auVar84),auVar219);
    auVar95 = vminps_avx(ZEXT1632(auVar84),auVar219);
    auVar92 = vpermt2ps_avx512vl(ZEXT1632(auVar84),_DAT_0205fd20,auVar96);
    auVar93 = vpermt2ps_avx512vl(auVar45,_DAT_0205fd20,auVar96);
    auVar88 = vpermt2ps_avx512vl(auVar46,_DAT_0205fd20,auVar96);
    auVar111 = ZEXT1632(auVar83);
    auVar89 = vpermt2ps_avx512vl(auVar47,_DAT_0205fd20,auVar111);
    auVar96 = vpermt2ps_avx512vl(auVar48,_DAT_0205fd20,auVar111);
    auVar90 = vsubps_avx512vl(auVar92,auVar96);
    auVar96 = vsubps_avx(auVar100,auVar99);
    auVar91 = vsubps_avx512vl(auVar101,local_860);
    auVar97 = vsubps_avx(auVar102,local_720);
    auVar225 = ZEXT3264(auVar97);
    auVar103 = vmulps_avx512vl(auVar91,auVar47);
    auVar103 = vfmsub231ps_avx512vl(auVar103,auVar46,auVar97);
    auVar104 = vmulps_avx512vl(auVar97,auVar45);
    auVar104 = vfmsub231ps_avx512vl(auVar104,auVar47,auVar96);
    auVar105 = vmulps_avx512vl(auVar96,auVar46);
    auVar105 = vfmsub231ps_avx512vl(auVar105,auVar45,auVar91);
    auVar105 = vmulps_avx512vl(auVar105,auVar105);
    auVar104 = vfmadd231ps_avx512vl(auVar105,auVar104,auVar104);
    auVar103 = vfmadd231ps_avx512vl(auVar104,auVar103,auVar103);
    auVar104 = vmulps_avx512vl(auVar97,auVar97);
    auVar104 = vfmadd231ps_avx512vl(auVar104,auVar91,auVar91);
    auVar104 = vfmadd231ps_avx512vl(auVar104,auVar96,auVar96);
    auVar105 = vrcp14ps_avx512vl(auVar104);
    auVar106 = vfnmadd213ps_avx512vl(auVar105,auVar104,auVar113);
    auVar105 = vfmadd132ps_avx512vl(auVar106,auVar105,auVar105);
    auVar103 = vmulps_avx512vl(auVar103,auVar105);
    auVar106 = vmulps_avx512vl(auVar91,auVar89);
    auVar106 = vfmsub231ps_avx512vl(auVar106,auVar88,auVar97);
    auVar107 = vmulps_avx512vl(auVar97,auVar93);
    auVar107 = vfmsub231ps_avx512vl(auVar107,auVar89,auVar96);
    auVar108 = vmulps_avx512vl(auVar96,auVar88);
    auVar108 = vfmsub231ps_avx512vl(auVar108,auVar93,auVar91);
    auVar108 = vmulps_avx512vl(auVar108,auVar108);
    auVar107 = vfmadd231ps_avx512vl(auVar108,auVar107,auVar107);
    auVar106 = vfmadd231ps_avx512vl(auVar107,auVar106,auVar106);
    auVar105 = vmulps_avx512vl(auVar106,auVar105);
    auVar103 = vmaxps_avx512vl(auVar103,auVar105);
    auVar103 = vsqrtps_avx512vl(auVar103);
    auVar105 = vmaxps_avx512vl(auVar90,auVar92);
    auVar94 = vmaxps_avx512vl(auVar94,auVar105);
    auVar105 = vaddps_avx512vl(auVar103,auVar94);
    auVar94 = vminps_avx512vl(auVar90,auVar92);
    auVar94 = vminps_avx(auVar95,auVar94);
    auVar94 = vsubps_avx512vl(auVar94,auVar103);
    auVar116._8_4_ = 0x3f800002;
    auVar116._0_8_ = 0x3f8000023f800002;
    auVar116._12_4_ = 0x3f800002;
    auVar116._16_4_ = 0x3f800002;
    auVar116._20_4_ = 0x3f800002;
    auVar116._24_4_ = 0x3f800002;
    auVar116._28_4_ = 0x3f800002;
    auVar95 = vmulps_avx512vl(auVar105,auVar116);
    auVar117._8_4_ = 0x3f7ffffc;
    auVar117._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar117._12_4_ = 0x3f7ffffc;
    auVar117._16_4_ = 0x3f7ffffc;
    auVar117._20_4_ = 0x3f7ffffc;
    auVar117._24_4_ = 0x3f7ffffc;
    auVar117._28_4_ = 0x3f7ffffc;
    local_8a0 = vmulps_avx512vl(auVar94,auVar117);
    auVar49._4_4_ = auVar95._4_4_ * auVar95._4_4_;
    auVar49._0_4_ = auVar95._0_4_ * auVar95._0_4_;
    auVar49._8_4_ = auVar95._8_4_ * auVar95._8_4_;
    auVar49._12_4_ = auVar95._12_4_ * auVar95._12_4_;
    auVar49._16_4_ = auVar95._16_4_ * auVar95._16_4_;
    auVar49._20_4_ = auVar95._20_4_ * auVar95._20_4_;
    auVar49._24_4_ = auVar95._24_4_ * auVar95._24_4_;
    auVar49._28_4_ = local_8a0._28_4_;
    auVar94 = vrsqrt14ps_avx512vl(auVar104);
    auVar209._8_4_ = 0xbf000000;
    auVar209._0_8_ = 0xbf000000bf000000;
    auVar209._12_4_ = 0xbf000000;
    auVar209._16_4_ = 0xbf000000;
    auVar209._20_4_ = 0xbf000000;
    auVar209._24_4_ = 0xbf000000;
    auVar209._28_4_ = 0xbf000000;
    auVar95 = vmulps_avx512vl(auVar104,auVar209);
    auVar50._4_4_ = auVar94._4_4_ * auVar95._4_4_;
    auVar50._0_4_ = auVar94._0_4_ * auVar95._0_4_;
    auVar50._8_4_ = auVar94._8_4_ * auVar95._8_4_;
    auVar50._12_4_ = auVar94._12_4_ * auVar95._12_4_;
    auVar50._16_4_ = auVar94._16_4_ * auVar95._16_4_;
    auVar50._20_4_ = auVar94._20_4_ * auVar95._20_4_;
    auVar50._24_4_ = auVar94._24_4_ * auVar95._24_4_;
    auVar50._28_4_ = auVar95._28_4_;
    auVar95 = vmulps_avx512vl(auVar94,auVar94);
    auVar95 = vmulps_avx512vl(auVar95,auVar50);
    auVar23._8_4_ = 0x3fc00000;
    auVar23._0_8_ = 0x3fc000003fc00000;
    auVar23._12_4_ = 0x3fc00000;
    auVar23._16_4_ = 0x3fc00000;
    auVar23._20_4_ = 0x3fc00000;
    auVar23._24_4_ = 0x3fc00000;
    auVar23._28_4_ = 0x3fc00000;
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar94,auVar23);
    auVar51._4_4_ = auVar95._4_4_ * auVar96._4_4_;
    auVar51._0_4_ = auVar95._0_4_ * auVar96._0_4_;
    auVar51._8_4_ = auVar95._8_4_ * auVar96._8_4_;
    auVar51._12_4_ = auVar95._12_4_ * auVar96._12_4_;
    auVar51._16_4_ = auVar95._16_4_ * auVar96._16_4_;
    auVar51._20_4_ = auVar95._20_4_ * auVar96._20_4_;
    auVar51._24_4_ = auVar95._24_4_ * auVar96._24_4_;
    auVar51._28_4_ = auVar94._28_4_;
    auVar94 = vmulps_avx512vl(auVar91,auVar95);
    auVar92 = vmulps_avx512vl(auVar97,auVar95);
    auVar90 = vsubps_avx512vl(auVar111,auVar99);
    auVar103 = vsubps_avx512vl(auVar111,local_860);
    auVar104 = vsubps_avx512vl(auVar111,local_720);
    auVar66._4_4_ = uStack_4bc;
    auVar66._0_4_ = local_4c0;
    auVar66._8_4_ = uStack_4b8;
    auVar66._12_4_ = uStack_4b4;
    auVar66._16_4_ = uStack_4b0;
    auVar66._20_4_ = uStack_4ac;
    auVar66._24_4_ = uStack_4a8;
    auVar66._28_4_ = uStack_4a4;
    auVar105 = vmulps_avx512vl(auVar66,auVar104);
    auVar105 = vfmadd231ps_avx512vl(auVar105,local_4a0,auVar103);
    auVar105 = vfmadd231ps_avx512vl(auVar105,local_480,auVar90);
    auVar106 = vmulps_avx512vl(auVar104,auVar104);
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar103,auVar103);
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar90,auVar90);
    auVar107 = vmulps_avx512vl(auVar66,auVar92);
    auVar107 = vfmadd231ps_avx512vl(auVar107,auVar94,local_4a0);
    auVar107 = vfmadd231ps_avx512vl(auVar107,auVar51,local_480);
    auVar92 = vmulps_avx512vl(auVar104,auVar92);
    auVar94 = vfmadd231ps_avx512vl(auVar92,auVar103,auVar94);
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar90,auVar51);
    local_660 = vmulps_avx512vl(auVar107,auVar107);
    auVar92 = vsubps_avx512vl(local_1c0,local_660);
    auVar108 = vmulps_avx512vl(auVar107,auVar94);
    auVar105 = vsubps_avx512vl(auVar105,auVar108);
    auVar105 = vaddps_avx512vl(auVar105,auVar105);
    auVar108 = vmulps_avx512vl(auVar94,auVar94);
    local_7c0 = vsubps_avx512vl(auVar106,auVar108);
    auVar106 = vsubps_avx512vl(local_7c0,auVar49);
    auVar108 = vmulps_avx512vl(auVar105,auVar105);
    auVar24._8_4_ = 0x40800000;
    auVar24._0_8_ = 0x4080000040800000;
    auVar24._12_4_ = 0x40800000;
    auVar24._16_4_ = 0x40800000;
    auVar24._20_4_ = 0x40800000;
    auVar24._24_4_ = 0x40800000;
    auVar24._28_4_ = 0x40800000;
    auVar109 = vmulps_avx512vl(auVar92,auVar24);
    auVar110 = vmulps_avx512vl(auVar109,auVar106);
    auVar110 = vsubps_avx512vl(auVar108,auVar110);
    uVar79 = vcmpps_avx512vl(auVar110,auVar111,5);
    bVar68 = (byte)uVar79;
    if (bVar68 == 0) {
      auVar114 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar115 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
    }
    else {
      auVar110 = vsqrtps_avx512vl(auVar110);
      auVar111 = vaddps_avx512vl(auVar92,auVar92);
      auVar112 = vrcp14ps_avx512vl(auVar111);
      auVar113 = vfnmadd213ps_avx512vl(auVar111,auVar112,auVar113);
      auVar113 = vfmadd132ps_avx512vl(auVar113,auVar112,auVar112);
      auVar98 = vxorps_avx512vl(auVar105,auVar98);
      auVar98 = vsubps_avx512vl(auVar98,auVar110);
      auVar98 = vmulps_avx512vl(auVar98,auVar113);
      auVar110 = vsubps_avx512vl(auVar110,auVar105);
      auVar110 = vmulps_avx512vl(auVar110,auVar113);
      auVar113 = vfmadd213ps_avx512vl(auVar107,auVar98,auVar94);
      local_520 = vmulps_avx512vl(auVar95,auVar113);
      auVar113 = vfmadd213ps_avx512vl(auVar107,auVar110,auVar94);
      local_540 = vmulps_avx512vl(auVar95,auVar113);
      auVar113 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar98 = vblendmps_avx512vl(auVar113,auVar98);
      auVar114._0_4_ =
           (uint)(bVar68 & 1) * auVar98._0_4_ | (uint)!(bool)(bVar68 & 1) * local_540._0_4_;
      bVar77 = (bool)((byte)(uVar79 >> 1) & 1);
      auVar114._4_4_ = (uint)bVar77 * auVar98._4_4_ | (uint)!bVar77 * local_540._4_4_;
      bVar77 = (bool)((byte)(uVar79 >> 2) & 1);
      auVar114._8_4_ = (uint)bVar77 * auVar98._8_4_ | (uint)!bVar77 * local_540._8_4_;
      bVar77 = (bool)((byte)(uVar79 >> 3) & 1);
      auVar114._12_4_ = (uint)bVar77 * auVar98._12_4_ | (uint)!bVar77 * local_540._12_4_;
      bVar77 = (bool)((byte)(uVar79 >> 4) & 1);
      auVar114._16_4_ = (uint)bVar77 * auVar98._16_4_ | (uint)!bVar77 * local_540._16_4_;
      bVar77 = (bool)((byte)(uVar79 >> 5) & 1);
      auVar114._20_4_ = (uint)bVar77 * auVar98._20_4_ | (uint)!bVar77 * local_540._20_4_;
      bVar77 = (bool)((byte)(uVar79 >> 6) & 1);
      auVar114._24_4_ = (uint)bVar77 * auVar98._24_4_ | (uint)!bVar77 * local_540._24_4_;
      bVar77 = SUB81(uVar79 >> 7,0);
      auVar114._28_4_ = (uint)bVar77 * auVar98._28_4_ | (uint)!bVar77 * local_540._28_4_;
      auVar208._8_4_ = 0xff800000;
      auVar208._0_8_ = 0xff800000ff800000;
      auVar208._12_4_ = 0xff800000;
      auVar208._16_4_ = 0xff800000;
      auVar208._20_4_ = 0xff800000;
      auVar208._24_4_ = 0xff800000;
      auVar208._28_4_ = 0xff800000;
      auVar98 = vblendmps_avx512vl(auVar208,auVar110);
      auVar115._0_4_ =
           (uint)(bVar68 & 1) * auVar98._0_4_ | (uint)!(bool)(bVar68 & 1) * auVar110._0_4_;
      bVar77 = (bool)((byte)(uVar79 >> 1) & 1);
      auVar115._4_4_ = (uint)bVar77 * auVar98._4_4_ | (uint)!bVar77 * auVar110._4_4_;
      bVar77 = (bool)((byte)(uVar79 >> 2) & 1);
      auVar115._8_4_ = (uint)bVar77 * auVar98._8_4_ | (uint)!bVar77 * auVar110._8_4_;
      bVar77 = (bool)((byte)(uVar79 >> 3) & 1);
      auVar115._12_4_ = (uint)bVar77 * auVar98._12_4_ | (uint)!bVar77 * auVar110._12_4_;
      bVar77 = (bool)((byte)(uVar79 >> 4) & 1);
      auVar115._16_4_ = (uint)bVar77 * auVar98._16_4_ | (uint)!bVar77 * auVar110._16_4_;
      bVar77 = (bool)((byte)(uVar79 >> 5) & 1);
      auVar115._20_4_ = (uint)bVar77 * auVar98._20_4_ | (uint)!bVar77 * auVar110._20_4_;
      bVar77 = (bool)((byte)(uVar79 >> 6) & 1);
      auVar115._24_4_ = (uint)bVar77 * auVar98._24_4_ | (uint)!bVar77 * auVar110._24_4_;
      bVar77 = SUB81(uVar79 >> 7,0);
      auVar115._28_4_ = (uint)bVar77 * auVar98._28_4_ | (uint)!bVar77 * auVar110._28_4_;
      auVar98 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(local_660,auVar98);
      auVar110 = vmaxps_avx512vl(local_4e0,auVar98);
      auVar25._8_4_ = 0x36000000;
      auVar25._0_8_ = 0x3600000036000000;
      auVar25._12_4_ = 0x36000000;
      auVar25._16_4_ = 0x36000000;
      auVar25._20_4_ = 0x36000000;
      auVar25._24_4_ = 0x36000000;
      auVar25._28_4_ = 0x36000000;
      auVar110 = vmulps_avx512vl(auVar110,auVar25);
      vandps_avx512vl(auVar92,auVar98);
      uVar71 = vcmpps_avx512vl(auVar110,auVar110,1);
      uVar79 = uVar79 & uVar71;
      bVar73 = (byte)uVar79;
      if (bVar73 != 0) {
        uVar71 = vcmpps_avx512vl(auVar106,_DAT_02020f00,2);
        auVar222._8_4_ = 0xff800000;
        auVar222._0_8_ = 0xff800000ff800000;
        auVar222._12_4_ = 0xff800000;
        auVar222._16_4_ = 0xff800000;
        auVar222._20_4_ = 0xff800000;
        auVar222._24_4_ = 0xff800000;
        auVar222._28_4_ = 0xff800000;
        auVar98 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar106 = vblendmps_avx512vl(auVar98,auVar222);
        bVar70 = (byte)uVar71;
        uVar80 = (uint)(bVar70 & 1) * auVar106._0_4_ | (uint)!(bool)(bVar70 & 1) * auVar110._0_4_;
        bVar77 = (bool)((byte)(uVar71 >> 1) & 1);
        uVar133 = (uint)bVar77 * auVar106._4_4_ | (uint)!bVar77 * auVar110._4_4_;
        bVar77 = (bool)((byte)(uVar71 >> 2) & 1);
        uVar134 = (uint)bVar77 * auVar106._8_4_ | (uint)!bVar77 * auVar110._8_4_;
        bVar77 = (bool)((byte)(uVar71 >> 3) & 1);
        uVar135 = (uint)bVar77 * auVar106._12_4_ | (uint)!bVar77 * auVar110._12_4_;
        bVar77 = (bool)((byte)(uVar71 >> 4) & 1);
        uVar136 = (uint)bVar77 * auVar106._16_4_ | (uint)!bVar77 * auVar110._16_4_;
        bVar77 = (bool)((byte)(uVar71 >> 5) & 1);
        uVar137 = (uint)bVar77 * auVar106._20_4_ | (uint)!bVar77 * auVar110._20_4_;
        bVar77 = (bool)((byte)(uVar71 >> 6) & 1);
        uVar138 = (uint)bVar77 * auVar106._24_4_ | (uint)!bVar77 * auVar110._24_4_;
        bVar77 = SUB81(uVar71 >> 7,0);
        uVar139 = (uint)bVar77 * auVar106._28_4_ | (uint)!bVar77 * auVar110._28_4_;
        auVar114._0_4_ = (bVar73 & 1) * uVar80 | !(bool)(bVar73 & 1) * auVar114._0_4_;
        bVar77 = (bool)((byte)(uVar79 >> 1) & 1);
        auVar114._4_4_ = bVar77 * uVar133 | !bVar77 * auVar114._4_4_;
        bVar77 = (bool)((byte)(uVar79 >> 2) & 1);
        auVar114._8_4_ = bVar77 * uVar134 | !bVar77 * auVar114._8_4_;
        bVar77 = (bool)((byte)(uVar79 >> 3) & 1);
        auVar114._12_4_ = bVar77 * uVar135 | !bVar77 * auVar114._12_4_;
        bVar77 = (bool)((byte)(uVar79 >> 4) & 1);
        auVar114._16_4_ = bVar77 * uVar136 | !bVar77 * auVar114._16_4_;
        bVar77 = (bool)((byte)(uVar79 >> 5) & 1);
        auVar114._20_4_ = bVar77 * uVar137 | !bVar77 * auVar114._20_4_;
        bVar77 = (bool)((byte)(uVar79 >> 6) & 1);
        auVar114._24_4_ = bVar77 * uVar138 | !bVar77 * auVar114._24_4_;
        bVar77 = SUB81(uVar79 >> 7,0);
        auVar114._28_4_ = bVar77 * uVar139 | !bVar77 * auVar114._28_4_;
        auVar98 = vblendmps_avx512vl(auVar222,auVar98);
        bVar77 = (bool)((byte)(uVar71 >> 1) & 1);
        bVar11 = (bool)((byte)(uVar71 >> 2) & 1);
        bVar12 = (bool)((byte)(uVar71 >> 3) & 1);
        bVar13 = (bool)((byte)(uVar71 >> 4) & 1);
        bVar14 = (bool)((byte)(uVar71 >> 5) & 1);
        bVar15 = (bool)((byte)(uVar71 >> 6) & 1);
        bVar16 = SUB81(uVar71 >> 7,0);
        auVar115._0_4_ =
             (uint)(bVar73 & 1) *
             ((uint)(bVar70 & 1) * auVar98._0_4_ | !(bool)(bVar70 & 1) * uVar80) |
             !(bool)(bVar73 & 1) * auVar115._0_4_;
        bVar10 = (bool)((byte)(uVar79 >> 1) & 1);
        auVar115._4_4_ =
             (uint)bVar10 * ((uint)bVar77 * auVar98._4_4_ | !bVar77 * uVar133) |
             !bVar10 * auVar115._4_4_;
        bVar77 = (bool)((byte)(uVar79 >> 2) & 1);
        auVar115._8_4_ =
             (uint)bVar77 * ((uint)bVar11 * auVar98._8_4_ | !bVar11 * uVar134) |
             !bVar77 * auVar115._8_4_;
        bVar77 = (bool)((byte)(uVar79 >> 3) & 1);
        auVar115._12_4_ =
             (uint)bVar77 * ((uint)bVar12 * auVar98._12_4_ | !bVar12 * uVar135) |
             !bVar77 * auVar115._12_4_;
        bVar77 = (bool)((byte)(uVar79 >> 4) & 1);
        auVar115._16_4_ =
             (uint)bVar77 * ((uint)bVar13 * auVar98._16_4_ | !bVar13 * uVar136) |
             !bVar77 * auVar115._16_4_;
        bVar77 = (bool)((byte)(uVar79 >> 5) & 1);
        auVar115._20_4_ =
             (uint)bVar77 * ((uint)bVar14 * auVar98._20_4_ | !bVar14 * uVar137) |
             !bVar77 * auVar115._20_4_;
        bVar77 = (bool)((byte)(uVar79 >> 6) & 1);
        auVar115._24_4_ =
             (uint)bVar77 * ((uint)bVar15 * auVar98._24_4_ | !bVar15 * uVar138) |
             !bVar77 * auVar115._24_4_;
        bVar77 = SUB81(uVar79 >> 7,0);
        auVar115._28_4_ =
             (uint)bVar77 * ((uint)bVar16 * auVar98._28_4_ | !bVar16 * uVar139) |
             !bVar77 * auVar115._28_4_;
        bVar68 = (~bVar73 | bVar70) & bVar68;
      }
      auVar213 = ZEXT3264(CONCAT428(0x3f800000,
                                    CONCAT424(0x3f800000,
                                              CONCAT420(0x3f800000,
                                                        CONCAT416(0x3f800000,
                                                                  CONCAT412(0x3f800000,
                                                                            CONCAT48(0x3f800000,
                                                                                     &
                                                  DAT_3f8000003f800000)))))));
    }
    fVar226 = (float)local_740._0_4_;
    fVar181 = (float)local_740._4_4_;
    fVar234 = fStack_738;
    fVar236 = fStack_734;
    fVar238 = fStack_730;
    fVar159 = fStack_72c;
    fVar161 = fStack_728;
    fVar163 = fStack_724;
    if ((bVar68 & 0x7f) == 0) {
      auVar94 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar251 = ZEXT3264(auVar94);
    }
    else {
      auVar209 = auVar213._0_32_;
      auVar83 = vsubss_avx512f(ZEXT416((uint)(ray->org).field_0.m128[3]),local_610);
      auVar210._0_4_ = auVar83._0_4_;
      auVar210._4_4_ = auVar210._0_4_;
      auVar210._8_4_ = auVar210._0_4_;
      auVar210._12_4_ = auVar210._0_4_;
      auVar210._16_4_ = auVar210._0_4_;
      auVar210._20_4_ = auVar210._0_4_;
      auVar210._24_4_ = auVar210._0_4_;
      auVar210._28_4_ = auVar210._0_4_;
      auVar98 = vmaxps_avx512vl(auVar210,auVar114);
      auVar83 = vsubss_avx512f(ZEXT416((uint)ray->tfar),local_610);
      auVar220._0_4_ = auVar83._0_4_;
      auVar220._4_4_ = auVar220._0_4_;
      auVar220._8_4_ = auVar220._0_4_;
      auVar220._12_4_ = auVar220._0_4_;
      auVar220._16_4_ = auVar220._0_4_;
      auVar220._20_4_ = auVar220._0_4_;
      auVar220._24_4_ = auVar220._0_4_;
      auVar220._28_4_ = auVar220._0_4_;
      auVar106 = vminps_avx512vl(auVar220,auVar115);
      auVar104 = vmulps_avx512vl(auVar47,auVar104);
      auVar103 = vfmadd213ps_avx512vl(auVar103,auVar46,auVar104);
      auVar90 = vfmadd213ps_avx512vl(auVar90,auVar45,auVar103);
      auVar67._4_4_ = uStack_4bc;
      auVar67._0_4_ = local_4c0;
      auVar67._8_4_ = uStack_4b8;
      auVar67._12_4_ = uStack_4b4;
      auVar67._16_4_ = uStack_4b0;
      auVar67._20_4_ = uStack_4ac;
      auVar67._24_4_ = uStack_4a8;
      auVar67._28_4_ = uStack_4a4;
      auVar103 = vmulps_avx512vl(auVar67,auVar47);
      auVar103 = vfmadd231ps_avx512vl(auVar103,local_4a0,auVar46);
      auVar103 = vfmadd231ps_avx512vl(auVar103,local_480,auVar45);
      auVar104 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar251 = ZEXT3264(auVar104);
      vandps_avx512vl(auVar103,auVar104);
      auVar110 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar17 = vcmpps_avx512vl(auVar104,auVar110,1);
      auVar113 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar90 = vxorps_avx512vl(auVar90,auVar113);
      auVar111 = vrcp14ps_avx512vl(auVar103);
      auVar112 = vxorps_avx512vl(auVar103,auVar113);
      auVar116 = vfnmadd213ps_avx512vl(auVar111,auVar103,auVar209);
      auVar116 = vfmadd132ps_avx512vl(auVar116,auVar111,auVar111);
      auVar90 = vmulps_avx512vl(auVar116,auVar90);
      uVar18 = vcmpps_avx512vl(auVar103,auVar112,1);
      bVar73 = (byte)uVar17 | (byte)uVar18;
      auVar116 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar117 = vblendmps_avx512vl(auVar90,auVar116);
      auVar118._0_4_ =
           (uint)(bVar73 & 1) * auVar117._0_4_ | (uint)!(bool)(bVar73 & 1) * auVar111._0_4_;
      bVar77 = (bool)(bVar73 >> 1 & 1);
      auVar118._4_4_ = (uint)bVar77 * auVar117._4_4_ | (uint)!bVar77 * auVar111._4_4_;
      bVar77 = (bool)(bVar73 >> 2 & 1);
      auVar118._8_4_ = (uint)bVar77 * auVar117._8_4_ | (uint)!bVar77 * auVar111._8_4_;
      bVar77 = (bool)(bVar73 >> 3 & 1);
      auVar118._12_4_ = (uint)bVar77 * auVar117._12_4_ | (uint)!bVar77 * auVar111._12_4_;
      bVar77 = (bool)(bVar73 >> 4 & 1);
      auVar118._16_4_ = (uint)bVar77 * auVar117._16_4_ | (uint)!bVar77 * auVar111._16_4_;
      bVar77 = (bool)(bVar73 >> 5 & 1);
      auVar118._20_4_ = (uint)bVar77 * auVar117._20_4_ | (uint)!bVar77 * auVar111._20_4_;
      bVar77 = (bool)(bVar73 >> 6 & 1);
      auVar118._24_4_ = (uint)bVar77 * auVar117._24_4_ | (uint)!bVar77 * auVar111._24_4_;
      auVar118._28_4_ =
           (uint)(bVar73 >> 7) * auVar117._28_4_ | (uint)!(bool)(bVar73 >> 7) * auVar111._28_4_;
      auVar98 = vmaxps_avx(auVar98,auVar118);
      uVar18 = vcmpps_avx512vl(auVar103,auVar112,6);
      bVar73 = (byte)uVar17 | (byte)uVar18;
      auVar103 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar119._0_4_ =
           (uint)(bVar73 & 1) * auVar103._0_4_ | (uint)!(bool)(bVar73 & 1) * auVar90._0_4_;
      bVar77 = (bool)(bVar73 >> 1 & 1);
      auVar119._4_4_ = (uint)bVar77 * auVar103._4_4_ | (uint)!bVar77 * auVar90._4_4_;
      bVar77 = (bool)(bVar73 >> 2 & 1);
      auVar119._8_4_ = (uint)bVar77 * auVar103._8_4_ | (uint)!bVar77 * auVar90._8_4_;
      bVar77 = (bool)(bVar73 >> 3 & 1);
      auVar119._12_4_ = (uint)bVar77 * auVar103._12_4_ | (uint)!bVar77 * auVar90._12_4_;
      bVar77 = (bool)(bVar73 >> 4 & 1);
      auVar119._16_4_ = (uint)bVar77 * auVar103._16_4_ | (uint)!bVar77 * auVar90._16_4_;
      bVar77 = (bool)(bVar73 >> 5 & 1);
      auVar119._20_4_ = (uint)bVar77 * auVar103._20_4_ | (uint)!bVar77 * auVar90._20_4_;
      bVar77 = (bool)(bVar73 >> 6 & 1);
      auVar119._24_4_ = (uint)bVar77 * auVar103._24_4_ | (uint)!bVar77 * auVar90._24_4_;
      auVar119._28_4_ =
           (uint)(bVar73 >> 7) * auVar103._28_4_ | (uint)!(bool)(bVar73 >> 7) * auVar90._28_4_;
      auVar90 = vminps_avx(auVar106,auVar119);
      auVar250 = ZEXT864(0) << 0x20;
      auVar100 = vsubps_avx(ZEXT832(0) << 0x20,auVar100);
      auVar101 = vsubps_avx(ZEXT832(0) << 0x20,auVar101);
      auVar106 = ZEXT832(0) << 0x20;
      auVar102 = vsubps_avx(auVar106,auVar102);
      auVar52._4_4_ = auVar102._4_4_ * auVar89._4_4_;
      auVar52._0_4_ = auVar102._0_4_ * auVar89._0_4_;
      auVar52._8_4_ = auVar102._8_4_ * auVar89._8_4_;
      auVar52._12_4_ = auVar102._12_4_ * auVar89._12_4_;
      auVar52._16_4_ = auVar102._16_4_ * auVar89._16_4_;
      auVar52._20_4_ = auVar102._20_4_ * auVar89._20_4_;
      auVar52._24_4_ = auVar102._24_4_ * auVar89._24_4_;
      auVar52._28_4_ = auVar102._28_4_;
      auVar101 = vfnmsub231ps_avx512vl(auVar52,auVar88,auVar101);
      auVar100 = vfnmadd231ps_avx512vl(auVar101,auVar93,auVar100);
      auVar101 = vmulps_avx512vl(auVar67,auVar89);
      auVar101 = vfnmsub231ps_avx512vl(auVar101,local_4a0,auVar88);
      auVar101 = vfnmadd231ps_avx512vl(auVar101,local_480,auVar93);
      vandps_avx512vl(auVar101,auVar104);
      uVar17 = vcmpps_avx512vl(auVar101,auVar110,1);
      auVar100 = vxorps_avx512vl(auVar100,auVar113);
      auVar102 = vrcp14ps_avx512vl(auVar101);
      auVar93 = vxorps_avx512vl(auVar101,auVar113);
      auVar244 = ZEXT3264(auVar93);
      auVar89 = vfnmadd213ps_avx512vl(auVar102,auVar101,auVar209);
      auVar83 = vfmadd132ps_fma(auVar89,auVar102,auVar102);
      auVar248 = ZEXT1664(auVar83);
      fVar203 = auVar83._0_4_ * auVar100._0_4_;
      fVar235 = auVar83._4_4_ * auVar100._4_4_;
      auVar53._4_4_ = fVar235;
      auVar53._0_4_ = fVar203;
      fVar237 = auVar83._8_4_ * auVar100._8_4_;
      auVar53._8_4_ = fVar237;
      fVar239 = auVar83._12_4_ * auVar100._12_4_;
      auVar53._12_4_ = fVar239;
      fVar240 = auVar100._16_4_ * 0.0;
      auVar53._16_4_ = fVar240;
      fVar245 = auVar100._20_4_ * 0.0;
      auVar53._20_4_ = fVar245;
      fVar140 = auVar100._24_4_ * 0.0;
      auVar53._24_4_ = fVar140;
      auVar53._28_4_ = auVar100._28_4_;
      uVar18 = vcmpps_avx512vl(auVar101,auVar93,1);
      bVar73 = (byte)uVar17 | (byte)uVar18;
      auVar89 = vblendmps_avx512vl(auVar53,auVar116);
      auVar120._0_4_ =
           (uint)(bVar73 & 1) * auVar89._0_4_ | (uint)!(bool)(bVar73 & 1) * auVar102._0_4_;
      bVar77 = (bool)(bVar73 >> 1 & 1);
      auVar120._4_4_ = (uint)bVar77 * auVar89._4_4_ | (uint)!bVar77 * auVar102._4_4_;
      bVar77 = (bool)(bVar73 >> 2 & 1);
      auVar120._8_4_ = (uint)bVar77 * auVar89._8_4_ | (uint)!bVar77 * auVar102._8_4_;
      bVar77 = (bool)(bVar73 >> 3 & 1);
      auVar120._12_4_ = (uint)bVar77 * auVar89._12_4_ | (uint)!bVar77 * auVar102._12_4_;
      bVar77 = (bool)(bVar73 >> 4 & 1);
      auVar120._16_4_ = (uint)bVar77 * auVar89._16_4_ | (uint)!bVar77 * auVar102._16_4_;
      bVar77 = (bool)(bVar73 >> 5 & 1);
      auVar120._20_4_ = (uint)bVar77 * auVar89._20_4_ | (uint)!bVar77 * auVar102._20_4_;
      bVar77 = (bool)(bVar73 >> 6 & 1);
      auVar120._24_4_ = (uint)bVar77 * auVar89._24_4_ | (uint)!bVar77 * auVar102._24_4_;
      auVar120._28_4_ =
           (uint)(bVar73 >> 7) * auVar89._28_4_ | (uint)!(bool)(bVar73 >> 7) * auVar102._28_4_;
      auVar241 = ZEXT3264(auVar120);
      _local_5a0 = vmaxps_avx(auVar98,auVar120);
      uVar18 = vcmpps_avx512vl(auVar101,auVar93,6);
      bVar73 = (byte)uVar17 | (byte)uVar18;
      auVar121._0_4_ =
           (uint)(bVar73 & 1) * auVar103._0_4_ | (uint)!(bool)(bVar73 & 1) * (int)fVar203;
      bVar77 = (bool)(bVar73 >> 1 & 1);
      auVar121._4_4_ = (uint)bVar77 * auVar103._4_4_ | (uint)!bVar77 * (int)fVar235;
      bVar77 = (bool)(bVar73 >> 2 & 1);
      auVar121._8_4_ = (uint)bVar77 * auVar103._8_4_ | (uint)!bVar77 * (int)fVar237;
      bVar77 = (bool)(bVar73 >> 3 & 1);
      auVar121._12_4_ = (uint)bVar77 * auVar103._12_4_ | (uint)!bVar77 * (int)fVar239;
      bVar77 = (bool)(bVar73 >> 4 & 1);
      auVar121._16_4_ = (uint)bVar77 * auVar103._16_4_ | (uint)!bVar77 * (int)fVar240;
      bVar77 = (bool)(bVar73 >> 5 & 1);
      auVar121._20_4_ = (uint)bVar77 * auVar103._20_4_ | (uint)!bVar77 * (int)fVar245;
      bVar77 = (bool)(bVar73 >> 6 & 1);
      auVar121._24_4_ = (uint)bVar77 * auVar103._24_4_ | (uint)!bVar77 * (int)fVar140;
      auVar121._28_4_ =
           (uint)(bVar73 >> 7) * auVar103._28_4_ | (uint)!(bool)(bVar73 >> 7) * auVar100._28_4_;
      auVar233 = ZEXT3264(auVar121);
      local_400 = vminps_avx(auVar90,auVar121);
      auVar232 = ZEXT3264(local_400);
      uVar17 = vcmpps_avx512vl(_local_5a0,local_400,2);
      bVar68 = bVar68 & 0x7f & (byte)uVar17;
      if (bVar68 == 0) {
        auVar213 = ZEXT3264(auVar209);
      }
      else {
        auVar98 = vmaxps_avx(auVar106,local_8a0);
        auVar100 = vminps_avx512vl(local_520,auVar209);
        auVar59 = ZEXT412(0);
        auVar101 = ZEXT1232(auVar59) << 0x20;
        auVar100 = vmaxps_avx(auVar100,ZEXT1232(auVar59) << 0x20);
        auVar102 = vminps_avx512vl(local_540,auVar209);
        auVar248 = ZEXT3264(CONCAT428(0x3e000000,
                                      CONCAT424(0x3e000000,
                                                CONCAT420(0x3e000000,
                                                          CONCAT416(0x3e000000,
                                                                    CONCAT412(0x3e000000,
                                                                              CONCAT48(0x3e000000,
                                                                                                                                                                              
                                                  0x3e0000003e000000)))))));
        auVar54._4_4_ = (auVar100._4_4_ + 1.0) * 0.125;
        auVar54._0_4_ = (auVar100._0_4_ + 0.0) * 0.125;
        auVar54._8_4_ = (auVar100._8_4_ + 2.0) * 0.125;
        auVar54._12_4_ = (auVar100._12_4_ + 3.0) * 0.125;
        auVar54._16_4_ = (auVar100._16_4_ + 4.0) * 0.125;
        auVar54._20_4_ = (auVar100._20_4_ + 5.0) * 0.125;
        auVar54._24_4_ = (auVar100._24_4_ + 6.0) * 0.125;
        auVar54._28_4_ = auVar100._28_4_ + 7.0;
        auVar83 = vfmadd213ps_fma(auVar54,local_700,local_8c0);
        local_520 = ZEXT1632(auVar83);
        auVar100 = vmaxps_avx(auVar102,ZEXT1232(auVar59) << 0x20);
        auVar55._4_4_ = (auVar100._4_4_ + 1.0) * 0.125;
        auVar55._0_4_ = (auVar100._0_4_ + 0.0) * 0.125;
        auVar55._8_4_ = (auVar100._8_4_ + 2.0) * 0.125;
        auVar55._12_4_ = (auVar100._12_4_ + 3.0) * 0.125;
        auVar55._16_4_ = (auVar100._16_4_ + 4.0) * 0.125;
        auVar55._20_4_ = (auVar100._20_4_ + 5.0) * 0.125;
        auVar55._24_4_ = (auVar100._24_4_ + 6.0) * 0.125;
        auVar55._28_4_ = auVar100._28_4_ + 7.0;
        auVar83 = vfmadd213ps_fma(auVar55,local_700,local_8c0);
        local_540 = ZEXT1632(auVar83);
        auVar211._0_4_ = auVar98._0_4_ * auVar98._0_4_;
        auVar211._4_4_ = auVar98._4_4_ * auVar98._4_4_;
        auVar211._8_4_ = auVar98._8_4_ * auVar98._8_4_;
        auVar211._12_4_ = auVar98._12_4_ * auVar98._12_4_;
        auVar211._16_4_ = auVar98._16_4_ * auVar98._16_4_;
        auVar211._20_4_ = auVar98._20_4_ * auVar98._20_4_;
        auVar211._24_4_ = auVar98._24_4_ * auVar98._24_4_;
        auVar211._28_4_ = 0;
        auVar98 = vsubps_avx(local_7c0,auVar211);
        auVar100 = vmulps_avx512vl(auVar109,auVar98);
        auVar122 = vsubps_avx512vl(auVar108,auVar100);
        uVar17 = vcmpps_avx512vl(auVar122,ZEXT1232(auVar59) << 0x20,5);
        bVar73 = (byte)uVar17;
        if (bVar73 == 0) {
          auVar94 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar213 = ZEXT864(0) << 0x20;
          auVar100 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar102 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar233 = ZEXT864(0) << 0x20;
          auVar123._8_4_ = 0x7f800000;
          auVar123._0_8_ = 0x7f8000007f800000;
          auVar123._12_4_ = 0x7f800000;
          auVar123._16_4_ = 0x7f800000;
          auVar123._20_4_ = 0x7f800000;
          auVar123._24_4_ = 0x7f800000;
          auVar123._28_4_ = 0x7f800000;
          auVar124._8_4_ = 0xff800000;
          auVar124._0_8_ = 0xff800000ff800000;
          auVar124._12_4_ = 0xff800000;
          auVar124._16_4_ = 0xff800000;
          auVar124._20_4_ = 0xff800000;
          auVar124._24_4_ = 0xff800000;
          auVar124._28_4_ = 0xff800000;
        }
        else {
          auVar84 = vxorps_avx512vl(auVar88._0_16_,auVar88._0_16_);
          uVar79 = vcmpps_avx512vl(auVar122,auVar106,5);
          auVar100 = vsqrtps_avx(auVar122);
          auVar221._0_4_ = auVar92._0_4_ + auVar92._0_4_;
          auVar221._4_4_ = auVar92._4_4_ + auVar92._4_4_;
          auVar221._8_4_ = auVar92._8_4_ + auVar92._8_4_;
          auVar221._12_4_ = auVar92._12_4_ + auVar92._12_4_;
          auVar221._16_4_ = auVar92._16_4_ + auVar92._16_4_;
          auVar221._20_4_ = auVar92._20_4_ + auVar92._20_4_;
          auVar221._24_4_ = auVar92._24_4_ + auVar92._24_4_;
          auVar221._28_4_ = auVar92._28_4_ + auVar92._28_4_;
          auVar101 = vrcp14ps_avx512vl(auVar221);
          auVar102 = vfnmadd213ps_avx512vl(auVar221,auVar101,auVar209);
          auVar83 = vfmadd132ps_fma(auVar102,auVar101,auVar101);
          auVar26._8_4_ = 0x80000000;
          auVar26._0_8_ = 0x8000000080000000;
          auVar26._12_4_ = 0x80000000;
          auVar26._16_4_ = 0x80000000;
          auVar26._20_4_ = 0x80000000;
          auVar26._24_4_ = 0x80000000;
          auVar26._28_4_ = 0x80000000;
          auVar101 = vxorps_avx512vl(auVar105,auVar26);
          auVar101 = vsubps_avx(auVar101,auVar100);
          auVar56._4_4_ = auVar101._4_4_ * auVar83._4_4_;
          auVar56._0_4_ = auVar101._0_4_ * auVar83._0_4_;
          auVar56._8_4_ = auVar101._8_4_ * auVar83._8_4_;
          auVar56._12_4_ = auVar101._12_4_ * auVar83._12_4_;
          auVar56._16_4_ = auVar101._16_4_ * 0.0;
          auVar56._20_4_ = auVar101._20_4_ * 0.0;
          auVar56._24_4_ = auVar101._24_4_ * 0.0;
          auVar56._28_4_ = 0x3e000000;
          auVar248 = ZEXT3264(auVar56);
          auVar100 = vsubps_avx512vl(auVar100,auVar105);
          auVar249._0_4_ = auVar100._0_4_ * auVar83._0_4_;
          auVar249._4_4_ = auVar100._4_4_ * auVar83._4_4_;
          auVar249._8_4_ = auVar100._8_4_ * auVar83._8_4_;
          auVar249._12_4_ = auVar100._12_4_ * auVar83._12_4_;
          auVar249._16_4_ = auVar100._16_4_ * 0.0;
          auVar249._20_4_ = auVar100._20_4_ * 0.0;
          auVar249._24_4_ = auVar100._24_4_ * 0.0;
          auVar249._28_4_ = 0;
          auVar250 = ZEXT3264(auVar249);
          auVar100 = vfmadd213ps_avx512vl(auVar107,auVar56,auVar94);
          auVar57._4_4_ = auVar95._4_4_ * auVar100._4_4_;
          auVar57._0_4_ = auVar95._0_4_ * auVar100._0_4_;
          auVar57._8_4_ = auVar95._8_4_ * auVar100._8_4_;
          auVar57._12_4_ = auVar95._12_4_ * auVar100._12_4_;
          auVar57._16_4_ = auVar95._16_4_ * auVar100._16_4_;
          auVar57._20_4_ = auVar95._20_4_ * auVar100._20_4_;
          auVar57._24_4_ = auVar95._24_4_ * auVar100._24_4_;
          auVar57._28_4_ = auVar101._28_4_;
          auVar100 = vmulps_avx512vl(local_480,auVar56);
          auVar101 = vmulps_avx512vl(local_4a0,auVar56);
          auVar93 = vmulps_avx512vl(auVar67,auVar56);
          auVar102 = vfmadd213ps_avx512vl(auVar96,auVar57,auVar99);
          auVar100 = vsubps_avx512vl(auVar100,auVar102);
          auVar102 = vfmadd213ps_avx512vl(auVar91,auVar57,local_860);
          auVar102 = vsubps_avx512vl(auVar101,auVar102);
          auVar83 = vfmadd213ps_fma(auVar57,auVar97,local_720);
          auVar101 = vsubps_avx(auVar93,ZEXT1632(auVar83));
          auVar233 = ZEXT3264(auVar101);
          auVar94 = vfmadd213ps_avx512vl(auVar107,auVar249,auVar94);
          auVar95 = vmulps_avx512vl(auVar95,auVar94);
          auVar94 = vmulps_avx512vl(local_480,auVar249);
          auVar93 = vmulps_avx512vl(local_4a0,auVar249);
          auVar88 = vmulps_avx512vl(auVar67,auVar249);
          auVar83 = vfmadd213ps_fma(auVar96,auVar95,auVar99);
          auVar101 = vsubps_avx(auVar94,ZEXT1632(auVar83));
          auVar83 = vfmadd213ps_fma(auVar91,auVar95,local_860);
          auVar94 = vsubps_avx512vl(auVar93,ZEXT1632(auVar83));
          auVar83 = vfmadd213ps_fma(auVar97,auVar95,local_720);
          auVar95 = vsubps_avx512vl(auVar88,ZEXT1632(auVar83));
          auVar213 = ZEXT3264(auVar95);
          auVar147._8_4_ = 0x7f800000;
          auVar147._0_8_ = 0x7f8000007f800000;
          auVar147._12_4_ = 0x7f800000;
          auVar147._16_4_ = 0x7f800000;
          auVar147._20_4_ = 0x7f800000;
          auVar147._24_4_ = 0x7f800000;
          auVar147._28_4_ = 0x7f800000;
          auVar95 = vblendmps_avx512vl(auVar147,auVar56);
          bVar77 = (bool)((byte)uVar79 & 1);
          auVar123._0_4_ = (uint)bVar77 * auVar95._0_4_ | (uint)!bVar77 * auVar99._0_4_;
          bVar77 = (bool)((byte)(uVar79 >> 1) & 1);
          auVar123._4_4_ = (uint)bVar77 * auVar95._4_4_ | (uint)!bVar77 * auVar99._4_4_;
          bVar77 = (bool)((byte)(uVar79 >> 2) & 1);
          auVar123._8_4_ = (uint)bVar77 * auVar95._8_4_ | (uint)!bVar77 * auVar99._8_4_;
          bVar77 = (bool)((byte)(uVar79 >> 3) & 1);
          auVar123._12_4_ = (uint)bVar77 * auVar95._12_4_ | (uint)!bVar77 * auVar99._12_4_;
          bVar77 = (bool)((byte)(uVar79 >> 4) & 1);
          auVar123._16_4_ = (uint)bVar77 * auVar95._16_4_ | (uint)!bVar77 * auVar99._16_4_;
          bVar77 = (bool)((byte)(uVar79 >> 5) & 1);
          auVar123._20_4_ = (uint)bVar77 * auVar95._20_4_ | (uint)!bVar77 * auVar99._20_4_;
          bVar77 = (bool)((byte)(uVar79 >> 6) & 1);
          auVar123._24_4_ = (uint)bVar77 * auVar95._24_4_ | (uint)!bVar77 * auVar99._24_4_;
          bVar77 = SUB81(uVar79 >> 7,0);
          auVar123._28_4_ = (uint)bVar77 * auVar95._28_4_ | (uint)!bVar77 * auVar99._28_4_;
          auVar148._8_4_ = 0xff800000;
          auVar148._0_8_ = 0xff800000ff800000;
          auVar148._12_4_ = 0xff800000;
          auVar148._16_4_ = 0xff800000;
          auVar148._20_4_ = 0xff800000;
          auVar148._24_4_ = 0xff800000;
          auVar148._28_4_ = 0xff800000;
          auVar95 = vblendmps_avx512vl(auVar148,auVar249);
          bVar77 = (bool)((byte)uVar79 & 1);
          auVar124._0_4_ = (uint)bVar77 * auVar95._0_4_ | (uint)!bVar77 * -0x800000;
          bVar77 = (bool)((byte)(uVar79 >> 1) & 1);
          auVar124._4_4_ = (uint)bVar77 * auVar95._4_4_ | (uint)!bVar77 * -0x800000;
          bVar77 = (bool)((byte)(uVar79 >> 2) & 1);
          auVar124._8_4_ = (uint)bVar77 * auVar95._8_4_ | (uint)!bVar77 * -0x800000;
          bVar77 = (bool)((byte)(uVar79 >> 3) & 1);
          auVar124._12_4_ = (uint)bVar77 * auVar95._12_4_ | (uint)!bVar77 * -0x800000;
          bVar77 = (bool)((byte)(uVar79 >> 4) & 1);
          auVar124._16_4_ = (uint)bVar77 * auVar95._16_4_ | (uint)!bVar77 * -0x800000;
          bVar77 = (bool)((byte)(uVar79 >> 5) & 1);
          auVar124._20_4_ = (uint)bVar77 * auVar95._20_4_ | (uint)!bVar77 * -0x800000;
          bVar77 = (bool)((byte)(uVar79 >> 6) & 1);
          auVar124._24_4_ = (uint)bVar77 * auVar95._24_4_ | (uint)!bVar77 * -0x800000;
          bVar77 = SUB81(uVar79 >> 7,0);
          auVar124._28_4_ = (uint)bVar77 * auVar95._28_4_ | (uint)!bVar77 * -0x800000;
          vandps_avx512vl(auVar104,local_660);
          auVar95 = vmaxps_avx(local_4e0,auVar124);
          auVar27._8_4_ = 0x36000000;
          auVar27._0_8_ = 0x3600000036000000;
          auVar27._12_4_ = 0x36000000;
          auVar27._16_4_ = 0x36000000;
          auVar27._20_4_ = 0x36000000;
          auVar27._24_4_ = 0x36000000;
          auVar27._28_4_ = 0x36000000;
          auVar122 = vmulps_avx512vl(auVar95,auVar27);
          vandps_avx512vl(auVar92,auVar104);
          uVar71 = vcmpps_avx512vl(auVar122,auVar122,1);
          uVar79 = uVar79 & uVar71;
          bVar70 = (byte)uVar79;
          if (bVar70 != 0) {
            uVar71 = vcmpps_avx512vl(auVar98,ZEXT1632(auVar84),2);
            auVar228._8_4_ = 0xff800000;
            auVar228._0_8_ = 0xff800000ff800000;
            auVar228._12_4_ = 0xff800000;
            auVar228._16_4_ = 0xff800000;
            auVar228._20_4_ = 0xff800000;
            auVar228._24_4_ = 0xff800000;
            auVar228._28_4_ = 0xff800000;
            auVar243._8_4_ = 0x7f800000;
            auVar243._0_8_ = 0x7f8000007f800000;
            auVar243._12_4_ = 0x7f800000;
            auVar243._16_4_ = 0x7f800000;
            auVar243._20_4_ = 0x7f800000;
            auVar243._24_4_ = 0x7f800000;
            auVar243._28_4_ = 0x7f800000;
            auVar95 = vblendmps_avx512vl(auVar243,auVar228);
            bVar69 = (byte)uVar71;
            uVar80 = (uint)(bVar69 & 1) * auVar95._0_4_ | (uint)!(bool)(bVar69 & 1) * auVar122._0_4_
            ;
            bVar77 = (bool)((byte)(uVar71 >> 1) & 1);
            uVar133 = (uint)bVar77 * auVar95._4_4_ | (uint)!bVar77 * auVar122._4_4_;
            bVar77 = (bool)((byte)(uVar71 >> 2) & 1);
            uVar134 = (uint)bVar77 * auVar95._8_4_ | (uint)!bVar77 * auVar122._8_4_;
            bVar77 = (bool)((byte)(uVar71 >> 3) & 1);
            uVar135 = (uint)bVar77 * auVar95._12_4_ | (uint)!bVar77 * auVar122._12_4_;
            bVar77 = (bool)((byte)(uVar71 >> 4) & 1);
            uVar136 = (uint)bVar77 * auVar95._16_4_ | (uint)!bVar77 * auVar122._16_4_;
            bVar77 = (bool)((byte)(uVar71 >> 5) & 1);
            uVar137 = (uint)bVar77 * auVar95._20_4_ | (uint)!bVar77 * auVar122._20_4_;
            bVar77 = (bool)((byte)(uVar71 >> 6) & 1);
            uVar138 = (uint)bVar77 * auVar95._24_4_ | (uint)!bVar77 * auVar122._24_4_;
            bVar77 = SUB81(uVar71 >> 7,0);
            uVar139 = (uint)bVar77 * auVar95._28_4_ | (uint)!bVar77 * auVar122._28_4_;
            auVar123._0_4_ = (bVar70 & 1) * uVar80 | !(bool)(bVar70 & 1) * auVar123._0_4_;
            bVar77 = (bool)((byte)(uVar79 >> 1) & 1);
            auVar123._4_4_ = bVar77 * uVar133 | !bVar77 * auVar123._4_4_;
            bVar77 = (bool)((byte)(uVar79 >> 2) & 1);
            auVar123._8_4_ = bVar77 * uVar134 | !bVar77 * auVar123._8_4_;
            bVar77 = (bool)((byte)(uVar79 >> 3) & 1);
            auVar123._12_4_ = bVar77 * uVar135 | !bVar77 * auVar123._12_4_;
            bVar77 = (bool)((byte)(uVar79 >> 4) & 1);
            auVar123._16_4_ = bVar77 * uVar136 | !bVar77 * auVar123._16_4_;
            bVar77 = (bool)((byte)(uVar79 >> 5) & 1);
            auVar123._20_4_ = bVar77 * uVar137 | !bVar77 * auVar123._20_4_;
            bVar77 = (bool)((byte)(uVar79 >> 6) & 1);
            auVar123._24_4_ = bVar77 * uVar138 | !bVar77 * auVar123._24_4_;
            bVar77 = SUB81(uVar79 >> 7,0);
            auVar123._28_4_ = bVar77 * uVar139 | !bVar77 * auVar123._28_4_;
            auVar95 = vblendmps_avx512vl(auVar228,auVar243);
            bVar77 = (bool)((byte)(uVar71 >> 1) & 1);
            bVar11 = (bool)((byte)(uVar71 >> 2) & 1);
            bVar12 = (bool)((byte)(uVar71 >> 3) & 1);
            bVar13 = (bool)((byte)(uVar71 >> 4) & 1);
            bVar14 = (bool)((byte)(uVar71 >> 5) & 1);
            bVar15 = (bool)((byte)(uVar71 >> 6) & 1);
            bVar16 = SUB81(uVar71 >> 7,0);
            auVar122._0_4_ =
                 (uint)(bVar70 & 1) *
                 ((uint)(bVar69 & 1) * auVar95._0_4_ | !(bool)(bVar69 & 1) * uVar80) |
                 !(bool)(bVar70 & 1) * auVar124._0_4_;
            bVar10 = (bool)((byte)(uVar79 >> 1) & 1);
            auVar122._4_4_ =
                 (uint)bVar10 * ((uint)bVar77 * auVar95._4_4_ | !bVar77 * uVar133) |
                 !bVar10 * auVar124._4_4_;
            bVar77 = (bool)((byte)(uVar79 >> 2) & 1);
            auVar122._8_4_ =
                 (uint)bVar77 * ((uint)bVar11 * auVar95._8_4_ | !bVar11 * uVar134) |
                 !bVar77 * auVar124._8_4_;
            bVar77 = (bool)((byte)(uVar79 >> 3) & 1);
            auVar122._12_4_ =
                 (uint)bVar77 * ((uint)bVar12 * auVar95._12_4_ | !bVar12 * uVar135) |
                 !bVar77 * auVar124._12_4_;
            bVar77 = (bool)((byte)(uVar79 >> 4) & 1);
            auVar122._16_4_ =
                 (uint)bVar77 * ((uint)bVar13 * auVar95._16_4_ | !bVar13 * uVar136) |
                 !bVar77 * auVar124._16_4_;
            bVar77 = (bool)((byte)(uVar79 >> 5) & 1);
            auVar122._20_4_ =
                 (uint)bVar77 * ((uint)bVar14 * auVar95._20_4_ | !bVar14 * uVar137) |
                 !bVar77 * auVar124._20_4_;
            bVar77 = (bool)((byte)(uVar79 >> 6) & 1);
            auVar122._24_4_ =
                 (uint)bVar77 * ((uint)bVar15 * auVar95._24_4_ | !bVar15 * uVar138) |
                 !bVar77 * auVar124._24_4_;
            bVar77 = SUB81(uVar79 >> 7,0);
            auVar122._28_4_ =
                 (uint)bVar77 * ((uint)bVar16 * auVar95._28_4_ | !bVar16 * uVar139) |
                 !bVar77 * auVar124._28_4_;
            bVar73 = (~bVar70 | bVar69) & bVar73;
            auVar124 = auVar122;
          }
        }
        uVar230 = *(undefined4 *)&(ray->dir).field_0;
        auVar227._4_4_ = uVar230;
        auVar227._0_4_ = uVar230;
        auVar227._8_4_ = uVar230;
        auVar227._12_4_ = uVar230;
        auVar227._16_4_ = uVar230;
        auVar227._20_4_ = uVar230;
        auVar227._24_4_ = uVar230;
        auVar227._28_4_ = uVar230;
        uVar230 = *(undefined4 *)((long)&(ray->dir).field_0 + 4);
        auVar229._4_4_ = uVar230;
        auVar229._0_4_ = uVar230;
        auVar229._8_4_ = uVar230;
        auVar229._12_4_ = uVar230;
        auVar229._16_4_ = uVar230;
        auVar229._20_4_ = uVar230;
        auVar229._24_4_ = uVar230;
        auVar229._28_4_ = uVar230;
        fVar203 = (ray->dir).field_0.m128[2];
        auVar244 = ZEXT3264(CONCAT428(fVar203,CONCAT424(fVar203,CONCAT420(fVar203,CONCAT416(fVar203,
                                                  CONCAT412(fVar203,CONCAT48(fVar203,CONCAT44(
                                                  fVar203,fVar203))))))));
        auVar225._0_4_ = fVar203 * auVar213._0_4_;
        auVar225._4_4_ = fVar203 * auVar213._4_4_;
        auVar225._8_4_ = fVar203 * auVar213._8_4_;
        auVar225._12_4_ = fVar203 * auVar213._12_4_;
        auVar225._16_4_ = fVar203 * auVar213._16_4_;
        auVar225._20_4_ = fVar203 * auVar213._20_4_;
        auVar225._28_36_ = auVar213._28_36_;
        auVar225._24_4_ = fVar203 * auVar213._24_4_;
        auVar83 = vfmadd231ps_fma(auVar225._0_32_,auVar229,auVar94);
        auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar227,auVar101);
        auVar241 = ZEXT3264(_local_5a0);
        _local_460 = _local_5a0;
        local_440 = vminps_avx(local_400,auVar123);
        vandps_avx512vl(ZEXT1632(auVar83),auVar104);
        _local_580 = vmaxps_avx(_local_5a0,auVar124);
        auVar225 = ZEXT3264(_local_580);
        _local_420 = _local_580;
        auVar149._8_4_ = 0x3e99999a;
        auVar149._0_8_ = 0x3e99999a3e99999a;
        auVar149._12_4_ = 0x3e99999a;
        auVar149._16_4_ = 0x3e99999a;
        auVar149._20_4_ = 0x3e99999a;
        auVar149._24_4_ = 0x3e99999a;
        auVar149._28_4_ = 0x3e99999a;
        uVar17 = vcmpps_avx512vl(auVar122,auVar149,1);
        local_7f4 = (undefined4)uVar17;
        uVar17 = vcmpps_avx512vl(_local_5a0,local_440,2);
        bVar70 = (byte)uVar17 & bVar68;
        uVar18 = vcmpps_avx512vl(_local_580,local_400,2);
        if ((bVar68 & ((byte)uVar18 | (byte)uVar17)) == 0) {
          auVar213 = ZEXT3264(CONCAT428(0x3f800000,
                                        CONCAT424(0x3f800000,
                                                  CONCAT420(0x3f800000,
                                                            CONCAT416(0x3f800000,
                                                                      CONCAT412(0x3f800000,
                                                                                CONCAT48(0x3f800000,
                                                                                         &
                                                  DAT_3f8000003f800000)))))));
        }
        else {
          auVar58._4_4_ = auVar233._4_4_ * fVar203;
          auVar58._0_4_ = auVar233._0_4_ * fVar203;
          auVar58._8_4_ = auVar233._8_4_ * fVar203;
          auVar58._12_4_ = auVar233._12_4_ * fVar203;
          auVar58._16_4_ = auVar233._16_4_ * fVar203;
          auVar58._20_4_ = auVar233._20_4_ * fVar203;
          auVar58._24_4_ = auVar233._24_4_ * fVar203;
          auVar58._28_4_ = 0x3e99999a;
          auVar83 = vfmadd213ps_fma(auVar102,auVar229,auVar58);
          auVar83 = vfmadd213ps_fma(auVar100,auVar227,ZEXT1632(auVar83));
          vandps_avx512vl(ZEXT1632(auVar83),auVar104);
          uVar17 = vcmpps_avx512vl(auVar122,auVar149,1);
          local_7fc = (uint)(byte)~bVar73;
          bVar73 = (byte)uVar17 | ~bVar73;
          auVar150._8_4_ = 2;
          auVar150._0_8_ = 0x200000002;
          auVar150._12_4_ = 2;
          auVar150._16_4_ = 2;
          auVar150._20_4_ = 2;
          auVar150._24_4_ = 2;
          auVar150._28_4_ = 2;
          auVar28._8_4_ = 3;
          auVar28._0_8_ = 0x300000003;
          auVar28._12_4_ = 3;
          auVar28._16_4_ = 3;
          auVar28._20_4_ = 3;
          auVar28._24_4_ = 3;
          auVar28._28_4_ = 3;
          auVar94 = vpblendmd_avx512vl(auVar150,auVar28);
          local_3e0._0_4_ = (uint)(bVar73 & 1) * auVar94._0_4_ | (uint)!(bool)(bVar73 & 1) * 2;
          bVar77 = (bool)(bVar73 >> 1 & 1);
          local_3e0._4_4_ = (uint)bVar77 * auVar94._4_4_ | (uint)!bVar77 * 2;
          bVar77 = (bool)(bVar73 >> 2 & 1);
          local_3e0._8_4_ = (uint)bVar77 * auVar94._8_4_ | (uint)!bVar77 * 2;
          bVar77 = (bool)(bVar73 >> 3 & 1);
          local_3e0._12_4_ = (uint)bVar77 * auVar94._12_4_ | (uint)!bVar77 * 2;
          bVar77 = (bool)(bVar73 >> 4 & 1);
          local_3e0._16_4_ = (uint)bVar77 * auVar94._16_4_ | (uint)!bVar77 * 2;
          bVar77 = (bool)(bVar73 >> 5 & 1);
          local_3e0._20_4_ = (uint)bVar77 * auVar94._20_4_ | (uint)!bVar77 * 2;
          bVar77 = (bool)(bVar73 >> 6 & 1);
          local_3e0._24_4_ = (uint)bVar77 * auVar94._24_4_ | (uint)!bVar77 * 2;
          local_3e0._28_4_ = (uint)(bVar73 >> 7) * auVar94._28_4_ | (uint)!(bool)(bVar73 >> 7) * 2;
          local_500 = vpbroadcastd_avx512vl();
          uVar17 = vpcmpd_avx512vl(local_500,local_3e0,5);
          local_7f8 = (uint)bVar70;
          bVar70 = (byte)uVar17 & bVar70;
          if (bVar70 == 0) {
            auVar215._8_4_ = 0x7fffffff;
            auVar215._0_8_ = 0x7fffffff7fffffff;
            auVar215._12_4_ = 0x7fffffff;
          }
          else {
            auVar84 = vminps_avx(local_680._0_16_,local_6c0._0_16_);
            auVar83 = vmaxps_avx(local_680._0_16_,local_6c0._0_16_);
            auVar4 = vminps_avx(local_6a0._0_16_,local_6e0._0_16_);
            auVar5 = vminps_avx(auVar84,auVar4);
            auVar84 = vmaxps_avx(local_6a0._0_16_,local_6e0._0_16_);
            auVar4 = vmaxps_avx(auVar83,auVar84);
            auVar183._8_4_ = 0x7fffffff;
            auVar183._0_8_ = 0x7fffffff7fffffff;
            auVar183._12_4_ = 0x7fffffff;
            auVar83 = vandps_avx(auVar5,auVar183);
            auVar84 = vandps_avx(auVar4,auVar183);
            auVar83 = vmaxps_avx(auVar83,auVar84);
            auVar84 = vmovshdup_avx(auVar83);
            auVar84 = vmaxss_avx(auVar84,auVar83);
            auVar83 = vshufpd_avx(auVar83,auVar83,1);
            auVar83 = vmaxss_avx(auVar83,auVar84);
            fVar226 = auVar83._0_4_ * 1.9073486e-06;
            local_620 = vshufps_avx(auVar4,auVar4,0xff);
            local_560 = (float)local_5a0._0_4_ + (float)local_740._0_4_;
            fStack_55c = (float)local_5a0._4_4_ + (float)local_740._4_4_;
            fStack_558 = fStack_598 + fStack_738;
            fStack_554 = fStack_594 + fStack_734;
            fStack_550 = fStack_590 + fStack_730;
            fStack_54c = fStack_58c + fStack_72c;
            fStack_548 = fStack_588 + fStack_728;
            fStack_544 = fStack_584 + fStack_724;
            do {
              auVar96 = local_8a0;
              auVar151._8_4_ = 0x7f800000;
              auVar151._0_8_ = 0x7f8000007f800000;
              auVar151._12_4_ = 0x7f800000;
              auVar151._16_4_ = 0x7f800000;
              auVar151._20_4_ = 0x7f800000;
              auVar151._24_4_ = 0x7f800000;
              auVar151._28_4_ = 0x7f800000;
              auVar94 = vblendmps_avx512vl(auVar151,_local_5a0);
              auVar125._0_4_ =
                   (uint)(bVar70 & 1) * auVar94._0_4_ | (uint)!(bool)(bVar70 & 1) * 0x7f800000;
              bVar77 = (bool)(bVar70 >> 1 & 1);
              auVar125._4_4_ = (uint)bVar77 * auVar94._4_4_ | (uint)!bVar77 * 0x7f800000;
              bVar77 = (bool)(bVar70 >> 2 & 1);
              auVar125._8_4_ = (uint)bVar77 * auVar94._8_4_ | (uint)!bVar77 * 0x7f800000;
              bVar77 = (bool)(bVar70 >> 3 & 1);
              auVar125._12_4_ = (uint)bVar77 * auVar94._12_4_ | (uint)!bVar77 * 0x7f800000;
              bVar77 = (bool)(bVar70 >> 4 & 1);
              auVar125._16_4_ = (uint)bVar77 * auVar94._16_4_ | (uint)!bVar77 * 0x7f800000;
              bVar77 = (bool)(bVar70 >> 5 & 1);
              auVar125._20_4_ = (uint)bVar77 * auVar94._20_4_ | (uint)!bVar77 * 0x7f800000;
              bVar77 = (bool)(bVar70 >> 6 & 1);
              auVar125._24_4_ = (uint)bVar77 * auVar94._24_4_ | (uint)!bVar77 * 0x7f800000;
              auVar125._28_4_ =
                   (uint)(bVar70 >> 7) * auVar94._28_4_ | (uint)!(bool)(bVar70 >> 7) * 0x7f800000;
              auVar94 = vshufps_avx(auVar125,auVar125,0xb1);
              auVar94 = vminps_avx(auVar125,auVar94);
              auVar95 = vshufpd_avx(auVar94,auVar94,5);
              auVar94 = vminps_avx(auVar94,auVar95);
              auVar95 = vpermpd_avx2(auVar94,0x4e);
              auVar94 = vminps_avx(auVar94,auVar95);
              uVar17 = vcmpps_avx512vl(auVar125,auVar94,0);
              bVar69 = (byte)uVar17 & bVar70;
              bVar73 = bVar70;
              if (bVar69 != 0) {
                bVar73 = bVar69;
              }
              iVar20 = 0;
              for (uVar80 = (uint)bVar73; (uVar80 & 1) == 0; uVar80 = uVar80 >> 1 | 0x80000000) {
                iVar20 = iVar20 + 1;
              }
              auVar241 = ZEXT464(*(uint *)(local_520 + (uint)(iVar20 << 2)));
              auVar232 = ZEXT464(*(uint *)(local_460 + (uint)(iVar20 << 2)));
              aVar2 = (ray->dir).field_0;
              local_660._0_16_ = (undefined1  [16])aVar2;
              auVar83 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
              if (auVar83._0_4_ < 0.0) {
                local_8c0._0_16_ = ZEXT416(*(uint *)(local_520 + (uint)(iVar20 << 2)));
                local_860._0_16_ = ZEXT416(*(uint *)(local_460 + (uint)(iVar20 << 2)));
                local_8a0[1] = 0;
                local_8a0[0] = bVar70;
                local_8a0._2_30_ = auVar96._2_30_;
                fVar181 = sqrtf(auVar83._0_4_);
                bVar70 = local_8a0[0];
                auVar232 = ZEXT1664(local_860._0_16_);
                auVar241 = ZEXT1664(local_8c0._0_16_);
              }
              else {
                auVar83 = vsqrtss_avx(auVar83,auVar83);
                fVar181 = auVar83._0_4_;
              }
              lVar76 = 5;
              do {
                local_860._0_16_ = auVar232._0_16_;
                uVar230 = auVar232._0_4_;
                auVar141._4_4_ = uVar230;
                auVar141._0_4_ = uVar230;
                auVar141._8_4_ = uVar230;
                auVar141._12_4_ = uVar230;
                auVar83 = vfmadd132ps_fma(auVar141,ZEXT816(0) << 0x40,local_660._0_16_);
                fVar161 = auVar241._0_4_;
                fVar159 = 1.0 - fVar161;
                fVar238 = fVar159 * fVar159 * fVar159;
                fVar234 = fVar161 * fVar161;
                fVar163 = fVar161 * fVar234;
                auVar84 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar238),
                                          ZEXT416((uint)fVar163));
                fVar236 = fVar161 * fVar159;
                local_8a0._0_16_ = ZEXT416((uint)fVar159);
                auVar5 = vfmadd231ss_fma(ZEXT416((uint)(fVar161 * fVar236 * 6.0)),
                                         ZEXT416((uint)(fVar236 * fVar159)),
                                         SUB6416(ZEXT464(0x41400000),0));
                auVar4 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar163),
                                         ZEXT416((uint)fVar238));
                auVar81 = vfmadd231ss_fma(ZEXT416((uint)(fVar236 * fVar159 * 6.0)),
                                          SUB6416(ZEXT464(0x41400000),0),
                                          ZEXT416((uint)(fVar161 * fVar236)));
                fVar238 = fVar238 * 0.16666667;
                fVar159 = (auVar84._0_4_ + auVar5._0_4_) * 0.16666667;
                fVar161 = (auVar4._0_4_ + auVar81._0_4_) * 0.16666667;
                fVar163 = fVar163 * 0.16666667;
                auVar184._0_4_ = fVar163 * (float)local_6e0._0_4_;
                auVar184._4_4_ = fVar163 * (float)local_6e0._4_4_;
                auVar184._8_4_ = fVar163 * fStack_6d8;
                auVar184._12_4_ = fVar163 * fStack_6d4;
                auVar214._4_4_ = fVar161;
                auVar214._0_4_ = fVar161;
                auVar214._8_4_ = fVar161;
                auVar214._12_4_ = fVar161;
                auVar84 = vfmadd132ps_fma(auVar214,auVar184,local_6a0._0_16_);
                auVar185._4_4_ = fVar159;
                auVar185._0_4_ = fVar159;
                auVar185._8_4_ = fVar159;
                auVar185._12_4_ = fVar159;
                auVar84 = vfmadd132ps_fma(auVar185,auVar84,local_6c0._0_16_);
                auVar165._4_4_ = fVar238;
                auVar165._0_4_ = fVar238;
                auVar165._8_4_ = fVar238;
                auVar165._12_4_ = fVar238;
                local_5b0 = vfmadd132ps_fma(auVar165,auVar84,local_680._0_16_);
                auVar83 = vsubps_avx(auVar83,local_5b0);
                local_700._0_16_ = auVar83;
                auVar83 = vdpps_avx(auVar83,auVar83,0x7f);
                local_8c0._0_16_ = auVar241._0_16_;
                local_720._0_16_ = auVar83;
                if (auVar83._0_4_ < 0.0) {
                  local_7c0._0_4_ = fVar234;
                  auVar244._0_4_ = sqrtf(auVar83._0_4_);
                  auVar244._4_60_ = extraout_var;
                  auVar83 = auVar244._0_16_;
                  auVar84 = local_8c0._0_16_;
                }
                else {
                  auVar83 = vsqrtss_avx(auVar83,auVar83);
                  local_7c0._0_4_ = fVar234;
                  auVar84 = auVar241._0_16_;
                }
                local_5c0 = local_8a0._0_4_;
                auVar4 = vfnmsub213ss_fma(auVar84,auVar84,ZEXT416((uint)(fVar236 * 4.0)));
                auVar84 = vfmadd231ss_fma(ZEXT416((uint)(fVar236 * 4.0)),local_8a0._0_16_,
                                          local_8a0._0_16_);
                fVar234 = local_5c0 * -local_5c0 * 0.5;
                fVar236 = auVar4._0_4_ * 0.5;
                fVar238 = auVar84._0_4_ * 0.5;
                local_7c0._0_4_ = (float)local_7c0._0_4_ * 0.5;
                auVar204._0_4_ = (float)local_7c0._0_4_ * (float)local_6e0._0_4_;
                auVar204._4_4_ = (float)local_7c0._0_4_ * (float)local_6e0._4_4_;
                auVar204._8_4_ = (float)local_7c0._0_4_ * fStack_6d8;
                auVar204._12_4_ = (float)local_7c0._0_4_ * fStack_6d4;
                auVar166._4_4_ = fVar238;
                auVar166._0_4_ = fVar238;
                auVar166._8_4_ = fVar238;
                auVar166._12_4_ = fVar238;
                auVar84 = vfmadd132ps_fma(auVar166,auVar204,local_6a0._0_16_);
                auVar186._4_4_ = fVar236;
                auVar186._0_4_ = fVar236;
                auVar186._8_4_ = fVar236;
                auVar186._12_4_ = fVar236;
                auVar84 = vfmadd132ps_fma(auVar186,auVar84,local_6c0._0_16_);
                auVar246._4_4_ = fVar234;
                auVar246._0_4_ = fVar234;
                auVar246._8_4_ = fVar234;
                auVar246._12_4_ = fVar234;
                local_7c0._0_16_ = vfmadd132ps_fma(auVar246,auVar84,local_680._0_16_);
                local_5d0 = vdpps_avx(local_7c0._0_16_,local_7c0._0_16_,0x7f);
                auVar60._12_4_ = 0;
                auVar60._0_12_ = ZEXT812(0);
                fVar234 = local_5d0._0_4_;
                local_820 = vrsqrt14ss_avx512f(auVar60 << 0x20,ZEXT416((uint)fVar234));
                fVar236 = local_820._0_4_;
                local_5e0 = vrcp14ss_avx512f(auVar60 << 0x20,ZEXT416((uint)fVar234));
                auVar84 = vfnmadd213ss_fma(local_5e0,local_5d0,ZEXT416(0x40000000));
                uVar80 = auVar83._0_4_;
                fStack_5bc = local_5c0;
                fStack_5b8 = local_5c0;
                fStack_5b4 = local_5c0;
                if (fVar234 < -fVar234) {
                  local_830._0_4_ = fVar234 * -0.5;
                  fVar238 = sqrtf(fVar234);
                  auVar83 = ZEXT416(uVar80);
                  fVar234 = (float)local_830._0_4_;
                  auVar4 = local_7c0._0_16_;
                }
                else {
                  auVar4 = vsqrtss_avx(local_5d0,local_5d0);
                  fVar238 = auVar4._0_4_;
                  fVar234 = fVar234 * -0.5;
                  auVar4 = local_7c0._0_16_;
                }
                fVar159 = local_820._0_4_;
                fVar234 = fVar236 * 1.5 + fVar234 * fVar159 * fVar159 * fVar159;
                local_820._0_4_ = auVar4._0_4_ * fVar234;
                local_820._4_4_ = auVar4._4_4_ * fVar234;
                local_820._8_4_ = auVar4._8_4_ * fVar234;
                local_820._12_4_ = auVar4._12_4_ * fVar234;
                auVar5 = vdpps_avx(local_700._0_16_,local_820,0x7f);
                fVar159 = auVar83._0_4_;
                auVar142._0_4_ = auVar5._0_4_ * auVar5._0_4_;
                auVar142._4_4_ = auVar5._4_4_ * auVar5._4_4_;
                auVar142._8_4_ = auVar5._8_4_ * auVar5._8_4_;
                auVar142._12_4_ = auVar5._12_4_ * auVar5._12_4_;
                auVar85 = vsubps_avx512vl(local_720._0_16_,auVar142);
                fVar236 = auVar85._0_4_;
                auVar167._4_12_ = ZEXT812(0) << 0x20;
                auVar167._0_4_ = fVar236;
                auVar81 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar167);
                auVar82 = vmulss_avx512f(auVar81,ZEXT416(0x3fc00000));
                auVar86 = vmulss_avx512f(auVar85,ZEXT416(0xbf000000));
                if (fVar236 < 0.0) {
                  local_830 = auVar5;
                  local_600 = fVar234;
                  fStack_5fc = fVar234;
                  fStack_5f8 = fVar234;
                  fStack_5f4 = fVar234;
                  local_5f0 = auVar81;
                  fVar236 = sqrtf(fVar236);
                  auVar86 = ZEXT416(auVar86._0_4_);
                  auVar82 = ZEXT416(auVar82._0_4_);
                  auVar83 = ZEXT416(uVar80);
                  auVar4 = local_7c0._0_16_;
                  auVar5 = local_830;
                  auVar81 = local_5f0;
                  fVar234 = local_600;
                  fVar161 = fStack_5fc;
                  fVar163 = fStack_5f8;
                  fVar203 = fStack_5f4;
                }
                else {
                  auVar85 = vsqrtss_avx(auVar85,auVar85);
                  fVar236 = auVar85._0_4_;
                  fVar161 = fVar234;
                  fVar163 = fVar234;
                  fVar203 = fVar234;
                }
                auVar248 = ZEXT1664(auVar4);
                auVar233 = ZEXT1664(local_700._0_16_);
                auVar94 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                auVar251 = ZEXT3264(auVar94);
                auVar6 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_8a0._0_16_,
                                         local_8c0._0_16_);
                auVar85 = vfmadd231ss_fma(local_8a0._0_16_,local_8c0._0_16_,
                                          SUB6416(ZEXT464(0xc0000000),0));
                fVar237 = local_8c0._0_4_;
                auVar187._0_4_ = fVar237 * (float)local_6e0._0_4_;
                auVar187._4_4_ = fVar237 * (float)local_6e0._4_4_;
                auVar187._8_4_ = fVar237 * fStack_6d8;
                auVar187._12_4_ = fVar237 * fStack_6d4;
                auVar205._0_4_ = auVar85._0_4_;
                auVar205._4_4_ = auVar205._0_4_;
                auVar205._8_4_ = auVar205._0_4_;
                auVar205._12_4_ = auVar205._0_4_;
                auVar85 = vfmadd132ps_fma(auVar205,auVar187,local_6a0._0_16_);
                auVar168._0_4_ = auVar6._0_4_;
                auVar168._4_4_ = auVar168._0_4_;
                auVar168._8_4_ = auVar168._0_4_;
                auVar168._12_4_ = auVar168._0_4_;
                auVar85 = vfmadd132ps_fma(auVar168,auVar85,local_6c0._0_16_);
                auVar62._4_4_ = fStack_5bc;
                auVar62._0_4_ = local_5c0;
                auVar62._8_4_ = fStack_5b8;
                auVar62._12_4_ = fStack_5b4;
                auVar85 = vfmadd132ps_fma(auVar62,auVar85,local_680._0_16_);
                auVar169._0_4_ = auVar85._0_4_ * (float)local_5d0._0_4_;
                auVar169._4_4_ = auVar85._4_4_ * (float)local_5d0._0_4_;
                auVar169._8_4_ = auVar85._8_4_ * (float)local_5d0._0_4_;
                auVar169._12_4_ = auVar85._12_4_ * (float)local_5d0._0_4_;
                auVar85 = vdpps_avx(auVar4,auVar85,0x7f);
                fVar235 = auVar85._0_4_;
                auVar188._0_4_ = auVar4._0_4_ * fVar235;
                auVar188._4_4_ = auVar4._4_4_ * fVar235;
                auVar188._8_4_ = auVar4._8_4_ * fVar235;
                auVar188._12_4_ = auVar4._12_4_ * fVar235;
                auVar6 = vsubps_avx(auVar169,auVar188);
                fVar235 = auVar84._0_4_ * (float)local_5e0._0_4_;
                auVar85 = vmaxss_avx(ZEXT416((uint)fVar226),
                                     ZEXT416((uint)((float)local_860._0_4_ * fVar181 * 1.9073486e-06
                                                   )));
                auVar21._8_4_ = 0x80000000;
                auVar21._0_8_ = 0x8000000080000000;
                auVar21._12_4_ = 0x80000000;
                auVar127._16_16_ = auVar94._16_16_;
                auVar87 = vxorps_avx512vl(auVar4,auVar21);
                auVar189._0_4_ = fVar234 * auVar6._0_4_ * fVar235;
                auVar189._4_4_ = fVar161 * auVar6._4_4_ * fVar235;
                auVar189._8_4_ = fVar163 * auVar6._8_4_ * fVar235;
                auVar189._12_4_ = fVar203 * auVar6._12_4_ * fVar235;
                auVar244 = ZEXT1664(local_820);
                auVar84 = vdpps_avx(auVar87,local_820,0x7f);
                auVar6 = vfmadd213ss_fma(auVar83,ZEXT416((uint)fVar226),auVar85);
                auVar83 = vdpps_avx(local_700._0_16_,auVar189,0x7f);
                auVar6 = vfmadd213ss_fma(ZEXT416((uint)(fVar159 + 1.0)),
                                         ZEXT416((uint)(fVar226 / fVar238)),auVar6);
                auVar250 = ZEXT1664(auVar6);
                fVar234 = auVar84._0_4_ + auVar83._0_4_;
                auVar83 = vdpps_avx(local_660._0_16_,local_820,0x7f);
                auVar84 = vdpps_avx(local_700._0_16_,auVar87,0x7f);
                auVar86 = vmulss_avx512f(auVar86,auVar81);
                auVar87 = vaddss_avx512f(auVar82,ZEXT416((uint)(auVar86._0_4_ *
                                                               auVar81._0_4_ * auVar81._0_4_)));
                auVar81 = vdpps_avx(local_700._0_16_,local_660._0_16_,0x7f);
                auVar82 = vfnmadd231ss_fma(auVar84,auVar5,ZEXT416((uint)fVar234));
                auVar86 = vfnmadd231ss_fma(auVar81,auVar5,auVar83);
                auVar84 = vpermilps_avx(local_5b0,0xff);
                fVar236 = fVar236 - auVar84._0_4_;
                auVar84 = vshufps_avx(auVar4,auVar4,0xff);
                auVar81 = vfmsub213ss_fma(auVar82,auVar87,auVar84);
                fVar238 = auVar86._0_4_ * auVar87._0_4_;
                auVar82 = vfmsub231ss_fma(ZEXT416((uint)(auVar83._0_4_ * auVar81._0_4_)),
                                          ZEXT416((uint)fVar234),ZEXT416((uint)fVar238));
                fVar159 = auVar82._0_4_;
                fVar238 = auVar5._0_4_ * (fVar238 / fVar159) - fVar236 * (auVar83._0_4_ / fVar159);
                auVar225 = ZEXT464((uint)fVar238);
                fVar237 = fVar237 - fVar238;
                auVar241 = ZEXT464((uint)fVar237);
                fVar234 = (float)local_860._0_4_ -
                          (fVar236 * (fVar234 / fVar159) - auVar5._0_4_ * (auVar81._0_4_ / fVar159))
                ;
                auVar232 = ZEXT464((uint)fVar234);
                auVar215._8_4_ = 0x7fffffff;
                auVar215._0_8_ = 0x7fffffff7fffffff;
                auVar215._12_4_ = 0x7fffffff;
                auVar83 = vandps_avx(auVar5,auVar215);
                bVar77 = true;
                if (auVar83._0_4_ < auVar6._0_4_) {
                  auVar5 = vfmadd231ss_fma(ZEXT416((uint)(auVar6._0_4_ + auVar85._0_4_)),local_620,
                                           ZEXT416(0x36000000));
                  auVar83 = vandps_avx(ZEXT416((uint)fVar236),auVar215);
                  if (auVar83._0_4_ < auVar5._0_4_) {
                    fVar234 = fVar234 + (float)local_610._0_4_;
                    auVar232 = ZEXT464((uint)fVar234);
                    if ((ray->org).field_0.m128[3] <= fVar234) {
                      fVar236 = ray->tfar;
                      auVar225 = ZEXT464((uint)fVar236);
                      if (((fVar234 <= fVar236) && (0.0 <= fVar237)) && (fVar237 <= 1.0)) {
                        auVar127._0_16_ = ZEXT816(0) << 0x20;
                        auVar126._4_28_ = auVar127._4_28_;
                        auVar126._0_4_ = local_720._0_4_;
                        auVar83 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar126._0_16_);
                        fVar238 = auVar83._0_4_;
                        auVar83 = vmulss_avx512f(local_720._0_16_,ZEXT416(0xbf000000));
                        pGVar8 = (local_8c8->scene->geometries).items[local_868].ptr;
                        if ((pGVar8->mask & ray->mask) != 0) {
                          if ((local_8c8->args->filter == (RTCFilterFunctionN)0x0) &&
                             (pGVar8->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                            unaff_R12 = 1;
                          }
                          else {
                            fVar238 = fVar238 * 1.5 + auVar83._0_4_ * fVar238 * fVar238 * fVar238;
                            auVar170._0_4_ = local_700._0_4_ * fVar238;
                            auVar170._4_4_ = local_700._4_4_ * fVar238;
                            auVar170._8_4_ = local_700._8_4_ * fVar238;
                            auVar170._12_4_ = local_700._12_4_ * fVar238;
                            auVar81 = vfmadd213ps_fma(auVar84,auVar170,auVar4);
                            auVar83 = vshufps_avx(auVar170,auVar170,0xc9);
                            auVar84 = vshufps_avx(auVar4,auVar4,0xc9);
                            auVar171._0_4_ = auVar170._0_4_ * auVar84._0_4_;
                            auVar171._4_4_ = auVar170._4_4_ * auVar84._4_4_;
                            auVar171._8_4_ = auVar170._8_4_ * auVar84._8_4_;
                            auVar171._12_4_ = auVar170._12_4_ * auVar84._12_4_;
                            auVar5 = vfmsub231ps_fma(auVar171,auVar4,auVar83);
                            auVar83 = vshufps_avx(auVar5,auVar5,0xc9);
                            auVar84 = vshufps_avx(auVar81,auVar81,0xc9);
                            auVar5 = vshufps_avx(auVar5,auVar5,0xd2);
                            auVar143._0_4_ = auVar81._0_4_ * auVar5._0_4_;
                            auVar143._4_4_ = auVar81._4_4_ * auVar5._4_4_;
                            auVar143._8_4_ = auVar81._8_4_ * auVar5._8_4_;
                            auVar143._12_4_ = auVar81._12_4_ * auVar5._12_4_;
                            auVar84 = vfmsub231ps_fma(auVar143,auVar83,auVar84);
                            auVar83 = vshufps_avx(auVar84,auVar84,0xe9);
                            local_790 = vmovlps_avx(auVar83);
                            local_788 = auVar84._0_4_;
                            local_780 = 0;
                            local_778 = (undefined4)local_868;
                            local_774 = local_8c8->user->instID[0];
                            local_770 = local_8c8->user->instPrimID[0];
                            ray->tfar = fVar234;
                            local_8cc = -1;
                            local_7f0.valid = &local_8cc;
                            local_7f0.geometryUserPtr = pGVar8->userPtr;
                            local_7f0.context = local_8c8->user;
                            local_7f0.hit = (RTCHitN *)&local_790;
                            local_7f0.N = 1;
                            local_8c0._0_16_ = ZEXT416((uint)fVar237);
                            local_860._0_16_ = ZEXT416((uint)fVar234);
                            local_8a0._0_4_ = fVar236;
                            local_7f0.ray = (RTCRayN *)ray;
                            local_784 = fVar237;
                            local_77c = uVar1;
                            if (pGVar8->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01d3c226:
                              p_Var9 = local_8c8->args->filter;
                              if (p_Var9 != (RTCFilterFunctionN)0x0) {
                                if (((local_8c8->args->flags &
                                     RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                     RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                                   (((pGVar8->field_8).field_0x2 & 0x40) != 0)) {
                                  auVar233 = ZEXT1664(auVar233._0_16_);
                                  auVar244 = ZEXT1664(auVar244._0_16_);
                                  auVar248 = ZEXT1664(auVar248._0_16_);
                                  auVar250 = ZEXT1664(auVar250._0_16_);
                                  (*p_Var9)(&local_7f0);
                                  auVar225 = ZEXT464((uint)local_8a0._0_4_);
                                  auVar232 = ZEXT1664(local_860._0_16_);
                                  auVar241 = ZEXT1664(local_8c0._0_16_);
                                  auVar215._8_4_ = 0x7fffffff;
                                  auVar215._0_8_ = 0x7fffffff7fffffff;
                                  auVar215._12_4_ = 0x7fffffff;
                                  auVar94 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                  auVar251 = ZEXT3264(auVar94);
                                }
                                if (*local_7f0.valid == 0) goto LAB_01d3c28c;
                              }
                              unaff_R12 = 1;
                            }
                            else {
                              auVar233 = ZEXT1664(local_700._0_16_);
                              auVar244 = ZEXT1664(local_820);
                              auVar248 = ZEXT1664(auVar4);
                              auVar250 = ZEXT1664(auVar6);
                              (*pGVar8->occlusionFilterN)(&local_7f0);
                              auVar225 = ZEXT464((uint)local_8a0._0_4_);
                              auVar232 = ZEXT1664(local_860._0_16_);
                              auVar241 = ZEXT1664(local_8c0._0_16_);
                              auVar215._8_4_ = 0x7fffffff;
                              auVar215._0_8_ = 0x7fffffff7fffffff;
                              auVar215._12_4_ = 0x7fffffff;
                              auVar94 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                              auVar251 = ZEXT3264(auVar94);
                              if (*local_7f0.valid != 0) goto LAB_01d3c226;
LAB_01d3c28c:
                              unaff_R12 = 0;
                            }
                            if ((char)unaff_R12 == '\0') {
                              ray->tfar = auVar225._0_4_;
                            }
                          }
                          bVar77 = false;
                          goto LAB_01d3c0ad;
                        }
                      }
                    }
                    bVar77 = false;
                    unaff_R12 = 0;
                  }
                }
LAB_01d3c0ad:
                bVar73 = (byte)unaff_R12;
                if (!bVar77) goto LAB_01d3c2af;
                lVar76 = lVar76 + -1;
              } while (lVar76 != 0);
              bVar73 = 0;
              auVar215._8_4_ = 0x7fffffff;
              auVar215._0_8_ = 0x7fffffff7fffffff;
              auVar215._12_4_ = 0x7fffffff;
LAB_01d3c2af:
              unaff_R12 = (ulong)(bVar73 & 1);
              bVar75 = bVar75 | bVar73 & 1;
              auVar64._4_4_ = fStack_55c;
              auVar64._0_4_ = local_560;
              auVar64._8_4_ = fStack_558;
              auVar64._12_4_ = fStack_554;
              auVar64._16_4_ = fStack_550;
              auVar64._20_4_ = fStack_54c;
              auVar64._24_4_ = fStack_548;
              auVar64._28_4_ = fStack_544;
              fVar181 = ray->tfar;
              auVar29._4_4_ = fVar181;
              auVar29._0_4_ = fVar181;
              auVar29._8_4_ = fVar181;
              auVar29._12_4_ = fVar181;
              auVar29._16_4_ = fVar181;
              auVar29._20_4_ = fVar181;
              auVar29._24_4_ = fVar181;
              auVar29._28_4_ = fVar181;
              uVar17 = vcmpps_avx512vl(auVar64,auVar29,2);
              bVar70 = ~('\x01' << ((byte)iVar20 & 0x1f)) & bVar70 & (byte)uVar17;
            } while (bVar70 != 0);
          }
          auVar152._0_4_ = (float)local_740._0_4_ + (float)local_580._0_4_;
          auVar152._4_4_ = (float)local_740._4_4_ + (float)local_580._4_4_;
          auVar152._8_4_ = fStack_738 + fStack_578;
          auVar152._12_4_ = fStack_734 + fStack_574;
          auVar152._16_4_ = fStack_730 + fStack_570;
          auVar152._20_4_ = fStack_72c + fStack_56c;
          auVar152._24_4_ = fStack_728 + fStack_568;
          auVar152._28_4_ = fStack_724 + fStack_564;
          fVar226 = ray->tfar;
          auVar30._4_4_ = fVar226;
          auVar30._0_4_ = fVar226;
          auVar30._8_4_ = fVar226;
          auVar30._12_4_ = fVar226;
          auVar30._16_4_ = fVar226;
          auVar30._20_4_ = fVar226;
          auVar30._24_4_ = fVar226;
          auVar30._28_4_ = fVar226;
          uVar17 = vcmpps_avx512vl(auVar152,auVar30,2);
          bVar73 = (byte)local_7f4 | (byte)local_7fc;
          bVar68 = (byte)uVar18 & bVar68 & (byte)uVar17;
          auVar153._8_4_ = 2;
          auVar153._0_8_ = 0x200000002;
          auVar153._12_4_ = 2;
          auVar153._16_4_ = 2;
          auVar153._20_4_ = 2;
          auVar153._24_4_ = 2;
          auVar153._28_4_ = 2;
          auVar31._8_4_ = 3;
          auVar31._0_8_ = 0x300000003;
          auVar31._12_4_ = 3;
          auVar31._16_4_ = 3;
          auVar31._20_4_ = 3;
          auVar31._24_4_ = 3;
          auVar31._28_4_ = 3;
          auVar94 = vpblendmd_avx512vl(auVar153,auVar31);
          local_580._0_4_ = (uint)(bVar73 & 1) * auVar94._0_4_ | (uint)!(bool)(bVar73 & 1) * 2;
          bVar77 = (bool)(bVar73 >> 1 & 1);
          local_580._4_4_ = (uint)bVar77 * auVar94._4_4_ | (uint)!bVar77 * 2;
          bVar77 = (bool)(bVar73 >> 2 & 1);
          fStack_578 = (float)((uint)bVar77 * auVar94._8_4_ | (uint)!bVar77 * 2);
          bVar77 = (bool)(bVar73 >> 3 & 1);
          fStack_574 = (float)((uint)bVar77 * auVar94._12_4_ | (uint)!bVar77 * 2);
          bVar77 = (bool)(bVar73 >> 4 & 1);
          fStack_570 = (float)((uint)bVar77 * auVar94._16_4_ | (uint)!bVar77 * 2);
          bVar77 = (bool)(bVar73 >> 5 & 1);
          fStack_56c = (float)((uint)bVar77 * auVar94._20_4_ | (uint)!bVar77 * 2);
          bVar77 = (bool)(bVar73 >> 6 & 1);
          fStack_568 = (float)((uint)bVar77 * auVar94._24_4_ | (uint)!bVar77 * 2);
          fStack_564 = (float)((uint)(bVar73 >> 7) * auVar94._28_4_ | (uint)!(bool)(bVar73 >> 7) * 2
                              );
          uVar17 = vpcmpd_avx512vl(_local_580,local_500,2);
          bVar73 = (byte)uVar17 & bVar68;
          fVar226 = (float)local_740._0_4_;
          fVar181 = (float)local_740._4_4_;
          fVar234 = fStack_738;
          fVar236 = fStack_734;
          fVar238 = fStack_730;
          fVar159 = fStack_72c;
          fVar161 = fStack_728;
          fVar163 = fStack_724;
          if (bVar73 != 0) {
            auVar84 = vminps_avx(local_680._0_16_,local_6c0._0_16_);
            auVar83 = vmaxps_avx(local_680._0_16_,local_6c0._0_16_);
            auVar4 = vminps_avx(local_6a0._0_16_,local_6e0._0_16_);
            auVar5 = vminps_avx(auVar84,auVar4);
            auVar84 = vmaxps_avx(local_6a0._0_16_,local_6e0._0_16_);
            auVar4 = vmaxps_avx(auVar83,auVar84);
            auVar83 = vandps_avx(auVar5,auVar215);
            auVar84 = vandps_avx(auVar4,auVar215);
            auVar83 = vmaxps_avx(auVar83,auVar84);
            auVar84 = vmovshdup_avx(auVar83);
            auVar84 = vmaxss_avx(auVar84,auVar83);
            auVar83 = vshufpd_avx(auVar83,auVar83,1);
            auVar83 = vmaxss_avx(auVar83,auVar84);
            fVar203 = auVar83._0_4_ * 1.9073486e-06;
            local_620 = vshufps_avx(auVar4,auVar4,0xff);
            _local_5a0 = _local_420;
            local_560 = (float)local_740._0_4_ + (float)local_420._0_4_;
            fStack_55c = (float)local_740._4_4_ + (float)local_420._4_4_;
            fStack_558 = fStack_738 + fStack_418;
            fStack_554 = fStack_734 + fStack_414;
            fStack_550 = fStack_730 + fStack_410;
            fStack_54c = fStack_72c + fStack_40c;
            fStack_548 = fStack_728 + fStack_408;
            fStack_544 = fStack_724 + fStack_404;
            do {
              auVar96 = local_8a0;
              auVar154._8_4_ = 0x7f800000;
              auVar154._0_8_ = 0x7f8000007f800000;
              auVar154._12_4_ = 0x7f800000;
              auVar154._16_4_ = 0x7f800000;
              auVar154._20_4_ = 0x7f800000;
              auVar154._24_4_ = 0x7f800000;
              auVar154._28_4_ = 0x7f800000;
              auVar94 = vblendmps_avx512vl(auVar154,_local_5a0);
              auVar128._0_4_ =
                   (uint)(bVar73 & 1) * auVar94._0_4_ | (uint)!(bool)(bVar73 & 1) * 0x7f800000;
              bVar77 = (bool)(bVar73 >> 1 & 1);
              auVar128._4_4_ = (uint)bVar77 * auVar94._4_4_ | (uint)!bVar77 * 0x7f800000;
              bVar77 = (bool)(bVar73 >> 2 & 1);
              auVar128._8_4_ = (uint)bVar77 * auVar94._8_4_ | (uint)!bVar77 * 0x7f800000;
              bVar77 = (bool)(bVar73 >> 3 & 1);
              auVar128._12_4_ = (uint)bVar77 * auVar94._12_4_ | (uint)!bVar77 * 0x7f800000;
              bVar77 = (bool)(bVar73 >> 4 & 1);
              auVar128._16_4_ = (uint)bVar77 * auVar94._16_4_ | (uint)!bVar77 * 0x7f800000;
              bVar77 = (bool)(bVar73 >> 5 & 1);
              auVar128._20_4_ = (uint)bVar77 * auVar94._20_4_ | (uint)!bVar77 * 0x7f800000;
              bVar77 = (bool)(bVar73 >> 6 & 1);
              auVar128._24_4_ = (uint)bVar77 * auVar94._24_4_ | (uint)!bVar77 * 0x7f800000;
              auVar128._28_4_ =
                   (uint)(bVar73 >> 7) * auVar94._28_4_ | (uint)!(bool)(bVar73 >> 7) * 0x7f800000;
              auVar94 = vshufps_avx(auVar128,auVar128,0xb1);
              auVar94 = vminps_avx(auVar128,auVar94);
              auVar95 = vshufpd_avx(auVar94,auVar94,5);
              auVar94 = vminps_avx(auVar94,auVar95);
              auVar95 = vpermpd_avx2(auVar94,0x4e);
              auVar94 = vminps_avx(auVar94,auVar95);
              uVar17 = vcmpps_avx512vl(auVar128,auVar94,0);
              bVar69 = (byte)uVar17 & bVar73;
              bVar70 = bVar73;
              if (bVar69 != 0) {
                bVar70 = bVar69;
              }
              iVar20 = 0;
              for (uVar80 = (uint)bVar70; (uVar80 & 1) == 0; uVar80 = uVar80 >> 1 | 0x80000000) {
                iVar20 = iVar20 + 1;
              }
              auVar241 = ZEXT464(*(uint *)(local_540 + (uint)(iVar20 << 2)));
              auVar232 = ZEXT464(*(uint *)(local_400 + (uint)(iVar20 << 2)));
              aVar2 = (ray->dir).field_0;
              local_660._0_16_ = (undefined1  [16])aVar2;
              auVar83 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
              if (auVar83._0_4_ < 0.0) {
                local_8c0._0_16_ = ZEXT416(*(uint *)(local_540 + (uint)(iVar20 << 2)));
                local_860._0_16_ = ZEXT416(*(uint *)(local_400 + (uint)(iVar20 << 2)));
                local_8a0[1] = 0;
                local_8a0[0] = bVar73;
                local_8a0._2_30_ = auVar96._2_30_;
                fVar235 = sqrtf(auVar83._0_4_);
                bVar73 = local_8a0[0];
                auVar232 = ZEXT1664(local_860._0_16_);
                auVar241 = ZEXT1664(local_8c0._0_16_);
              }
              else {
                auVar83 = vsqrtss_avx(auVar83,auVar83);
                fVar235 = auVar83._0_4_;
              }
              lVar76 = 5;
              do {
                local_860._0_16_ = auVar232._0_16_;
                uVar230 = auVar232._0_4_;
                auVar144._4_4_ = uVar230;
                auVar144._0_4_ = uVar230;
                auVar144._8_4_ = uVar230;
                auVar144._12_4_ = uVar230;
                auVar83 = vfmadd132ps_fma(auVar144,ZEXT816(0) << 0x40,local_660._0_16_);
                fVar238 = auVar241._0_4_;
                fVar236 = 1.0 - fVar238;
                fVar234 = fVar236 * fVar236 * fVar236;
                fVar226 = fVar238 * fVar238;
                fVar159 = fVar238 * fVar226;
                auVar84 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar234),
                                          ZEXT416((uint)fVar159));
                fVar181 = fVar238 * fVar236;
                local_8a0._0_16_ = ZEXT416((uint)fVar236);
                auVar5 = vfmadd231ss_fma(ZEXT416((uint)(fVar238 * fVar181 * 6.0)),
                                         ZEXT416((uint)(fVar181 * fVar236)),
                                         SUB6416(ZEXT464(0x41400000),0));
                auVar4 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar159),
                                         ZEXT416((uint)fVar234));
                auVar81 = vfmadd231ss_fma(ZEXT416((uint)(fVar181 * fVar236 * 6.0)),
                                          SUB6416(ZEXT464(0x41400000),0),
                                          ZEXT416((uint)(fVar238 * fVar181)));
                fVar234 = fVar234 * 0.16666667;
                fVar236 = (auVar84._0_4_ + auVar5._0_4_) * 0.16666667;
                fVar238 = (auVar4._0_4_ + auVar81._0_4_) * 0.16666667;
                fVar159 = fVar159 * 0.16666667;
                auVar190._0_4_ = fVar159 * (float)local_6e0._0_4_;
                auVar190._4_4_ = fVar159 * (float)local_6e0._4_4_;
                auVar190._8_4_ = fVar159 * fStack_6d8;
                auVar190._12_4_ = fVar159 * fStack_6d4;
                auVar216._4_4_ = fVar238;
                auVar216._0_4_ = fVar238;
                auVar216._8_4_ = fVar238;
                auVar216._12_4_ = fVar238;
                auVar84 = vfmadd132ps_fma(auVar216,auVar190,local_6a0._0_16_);
                auVar191._4_4_ = fVar236;
                auVar191._0_4_ = fVar236;
                auVar191._8_4_ = fVar236;
                auVar191._12_4_ = fVar236;
                auVar84 = vfmadd132ps_fma(auVar191,auVar84,local_6c0._0_16_);
                auVar172._4_4_ = fVar234;
                auVar172._0_4_ = fVar234;
                auVar172._8_4_ = fVar234;
                auVar172._12_4_ = fVar234;
                local_5b0 = vfmadd132ps_fma(auVar172,auVar84,local_680._0_16_);
                auVar83 = vsubps_avx(auVar83,local_5b0);
                local_700._0_16_ = auVar83;
                auVar83 = vdpps_avx(auVar83,auVar83,0x7f);
                local_8c0._0_16_ = auVar241._0_16_;
                local_720._0_16_ = auVar83;
                if (auVar83._0_4_ < 0.0) {
                  local_7c0._0_4_ = fVar226;
                  auVar248._0_4_ = sqrtf(auVar83._0_4_);
                  auVar248._4_60_ = extraout_var_00;
                  auVar83 = auVar248._0_16_;
                  auVar84 = local_8c0._0_16_;
                }
                else {
                  auVar83 = vsqrtss_avx(auVar83,auVar83);
                  local_7c0._0_4_ = fVar226;
                  auVar84 = auVar241._0_16_;
                }
                local_5c0 = local_8a0._0_4_;
                auVar4 = vfnmsub213ss_fma(auVar84,auVar84,ZEXT416((uint)(fVar181 * 4.0)));
                auVar84 = vfmadd231ss_fma(ZEXT416((uint)(fVar181 * 4.0)),local_8a0._0_16_,
                                          local_8a0._0_16_);
                fVar226 = local_5c0 * -local_5c0 * 0.5;
                fVar181 = auVar4._0_4_ * 0.5;
                fVar234 = auVar84._0_4_ * 0.5;
                local_7c0._0_4_ = (float)local_7c0._0_4_ * 0.5;
                auVar206._0_4_ = (float)local_7c0._0_4_ * (float)local_6e0._0_4_;
                auVar206._4_4_ = (float)local_7c0._0_4_ * (float)local_6e0._4_4_;
                auVar206._8_4_ = (float)local_7c0._0_4_ * fStack_6d8;
                auVar206._12_4_ = (float)local_7c0._0_4_ * fStack_6d4;
                auVar173._4_4_ = fVar234;
                auVar173._0_4_ = fVar234;
                auVar173._8_4_ = fVar234;
                auVar173._12_4_ = fVar234;
                auVar84 = vfmadd132ps_fma(auVar173,auVar206,local_6a0._0_16_);
                auVar192._4_4_ = fVar181;
                auVar192._0_4_ = fVar181;
                auVar192._8_4_ = fVar181;
                auVar192._12_4_ = fVar181;
                auVar84 = vfmadd132ps_fma(auVar192,auVar84,local_6c0._0_16_);
                auVar247._4_4_ = fVar226;
                auVar247._0_4_ = fVar226;
                auVar247._8_4_ = fVar226;
                auVar247._12_4_ = fVar226;
                local_7c0._0_16_ = vfmadd132ps_fma(auVar247,auVar84,local_680._0_16_);
                local_5d0 = vdpps_avx(local_7c0._0_16_,local_7c0._0_16_,0x7f);
                auVar61._12_4_ = 0;
                auVar61._0_12_ = ZEXT812(0);
                fVar226 = local_5d0._0_4_;
                local_820 = vrsqrt14ss_avx512f(auVar61 << 0x20,ZEXT416((uint)fVar226));
                fVar181 = local_820._0_4_;
                local_5e0 = vrcp14ss_avx512f(auVar61 << 0x20,ZEXT416((uint)fVar226));
                auVar84 = vfnmadd213ss_fma(local_5e0,local_5d0,ZEXT416(0x40000000));
                uVar80 = auVar83._0_4_;
                fStack_5bc = local_5c0;
                fStack_5b8 = local_5c0;
                fStack_5b4 = local_5c0;
                if (fVar226 < -fVar226) {
                  local_830._0_4_ = fVar226 * -0.5;
                  fVar234 = sqrtf(fVar226);
                  auVar83 = ZEXT416(uVar80);
                  fVar226 = (float)local_830._0_4_;
                  auVar4 = local_7c0._0_16_;
                }
                else {
                  auVar4 = vsqrtss_avx(local_5d0,local_5d0);
                  fVar234 = auVar4._0_4_;
                  fVar226 = fVar226 * -0.5;
                  auVar4 = local_7c0._0_16_;
                }
                fVar236 = local_820._0_4_;
                fVar226 = fVar181 * 1.5 + fVar226 * fVar236 * fVar236 * fVar236;
                local_820._0_4_ = auVar4._0_4_ * fVar226;
                local_820._4_4_ = auVar4._4_4_ * fVar226;
                local_820._8_4_ = auVar4._8_4_ * fVar226;
                local_820._12_4_ = auVar4._12_4_ * fVar226;
                auVar5 = vdpps_avx(local_700._0_16_,local_820,0x7f);
                fVar236 = auVar83._0_4_;
                auVar145._0_4_ = auVar5._0_4_ * auVar5._0_4_;
                auVar145._4_4_ = auVar5._4_4_ * auVar5._4_4_;
                auVar145._8_4_ = auVar5._8_4_ * auVar5._8_4_;
                auVar145._12_4_ = auVar5._12_4_ * auVar5._12_4_;
                auVar85 = vsubps_avx512vl(local_720._0_16_,auVar145);
                fVar181 = auVar85._0_4_;
                auVar174._4_12_ = ZEXT812(0) << 0x20;
                auVar174._0_4_ = fVar181;
                auVar81 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar174);
                auVar82 = vmulss_avx512f(auVar81,ZEXT416(0x3fc00000));
                auVar86 = vmulss_avx512f(auVar85,ZEXT416(0xbf000000));
                if (fVar181 < 0.0) {
                  local_830 = auVar5;
                  local_600 = fVar226;
                  fStack_5fc = fVar226;
                  fStack_5f8 = fVar226;
                  fStack_5f4 = fVar226;
                  local_5f0 = auVar81;
                  fVar237 = sqrtf(fVar181);
                  auVar86 = ZEXT416(auVar86._0_4_);
                  auVar82 = ZEXT416(auVar82._0_4_);
                  auVar83 = ZEXT416(uVar80);
                  auVar4 = local_7c0._0_16_;
                  auVar5 = local_830;
                  auVar81 = local_5f0;
                  fVar226 = local_600;
                  fVar181 = fStack_5fc;
                  fVar238 = fStack_5f8;
                  fVar159 = fStack_5f4;
                }
                else {
                  auVar85 = vsqrtss_avx(auVar85,auVar85);
                  fVar237 = auVar85._0_4_;
                  fVar181 = fVar226;
                  fVar238 = fVar226;
                  fVar159 = fVar226;
                }
                auVar248 = ZEXT1664(auVar4);
                auVar233 = ZEXT1664(local_700._0_16_);
                auVar94 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                auVar251 = ZEXT3264(auVar94);
                auVar6 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_8a0._0_16_,
                                         local_8c0._0_16_);
                auVar85 = vfmadd231ss_fma(local_8a0._0_16_,local_8c0._0_16_,
                                          SUB6416(ZEXT464(0xc0000000),0));
                fVar240 = local_8c0._0_4_;
                auVar193._0_4_ = fVar240 * (float)local_6e0._0_4_;
                auVar193._4_4_ = fVar240 * (float)local_6e0._4_4_;
                auVar193._8_4_ = fVar240 * fStack_6d8;
                auVar193._12_4_ = fVar240 * fStack_6d4;
                auVar207._0_4_ = auVar85._0_4_;
                auVar207._4_4_ = auVar207._0_4_;
                auVar207._8_4_ = auVar207._0_4_;
                auVar207._12_4_ = auVar207._0_4_;
                auVar85 = vfmadd132ps_fma(auVar207,auVar193,local_6a0._0_16_);
                auVar175._0_4_ = auVar6._0_4_;
                auVar175._4_4_ = auVar175._0_4_;
                auVar175._8_4_ = auVar175._0_4_;
                auVar175._12_4_ = auVar175._0_4_;
                auVar85 = vfmadd132ps_fma(auVar175,auVar85,local_6c0._0_16_);
                auVar63._4_4_ = fStack_5bc;
                auVar63._0_4_ = local_5c0;
                auVar63._8_4_ = fStack_5b8;
                auVar63._12_4_ = fStack_5b4;
                auVar85 = vfmadd132ps_fma(auVar63,auVar85,local_680._0_16_);
                auVar176._0_4_ = auVar85._0_4_ * (float)local_5d0._0_4_;
                auVar176._4_4_ = auVar85._4_4_ * (float)local_5d0._0_4_;
                auVar176._8_4_ = auVar85._8_4_ * (float)local_5d0._0_4_;
                auVar176._12_4_ = auVar85._12_4_ * (float)local_5d0._0_4_;
                auVar85 = vdpps_avx(auVar4,auVar85,0x7f);
                fVar161 = auVar85._0_4_;
                auVar194._0_4_ = auVar4._0_4_ * fVar161;
                auVar194._4_4_ = auVar4._4_4_ * fVar161;
                auVar194._8_4_ = auVar4._8_4_ * fVar161;
                auVar194._12_4_ = auVar4._12_4_ * fVar161;
                auVar6 = vsubps_avx(auVar176,auVar194);
                fVar161 = auVar84._0_4_ * (float)local_5e0._0_4_;
                auVar85 = vmaxss_avx(ZEXT416((uint)fVar203),
                                     ZEXT416((uint)((float)local_860._0_4_ * fVar235 * 1.9073486e-06
                                                   )));
                auVar22._8_4_ = 0x80000000;
                auVar22._0_8_ = 0x8000000080000000;
                auVar22._12_4_ = 0x80000000;
                auVar130._16_16_ = auVar94._16_16_;
                auVar87 = vxorps_avx512vl(auVar4,auVar22);
                auVar195._0_4_ = fVar226 * auVar6._0_4_ * fVar161;
                auVar195._4_4_ = fVar181 * auVar6._4_4_ * fVar161;
                auVar195._8_4_ = fVar238 * auVar6._8_4_ * fVar161;
                auVar195._12_4_ = fVar159 * auVar6._12_4_ * fVar161;
                auVar244 = ZEXT1664(local_820);
                auVar84 = vdpps_avx(auVar87,local_820,0x7f);
                auVar6 = vfmadd213ss_fma(auVar83,ZEXT416((uint)fVar203),auVar85);
                auVar83 = vdpps_avx(local_700._0_16_,auVar195,0x7f);
                auVar6 = vfmadd213ss_fma(ZEXT416((uint)(fVar236 + 1.0)),
                                         ZEXT416((uint)(fVar203 / fVar234)),auVar6);
                auVar250 = ZEXT1664(auVar6);
                fVar226 = auVar84._0_4_ + auVar83._0_4_;
                auVar83 = vdpps_avx(local_660._0_16_,local_820,0x7f);
                auVar84 = vdpps_avx(local_700._0_16_,auVar87,0x7f);
                auVar86 = vmulss_avx512f(auVar86,auVar81);
                auVar87 = vaddss_avx512f(auVar82,ZEXT416((uint)(auVar86._0_4_ *
                                                               auVar81._0_4_ * auVar81._0_4_)));
                auVar81 = vdpps_avx(local_700._0_16_,local_660._0_16_,0x7f);
                auVar82 = vfnmadd231ss_fma(auVar84,auVar5,ZEXT416((uint)fVar226));
                auVar86 = vfnmadd231ss_fma(auVar81,auVar5,auVar83);
                auVar84 = vpermilps_avx(local_5b0,0xff);
                fVar237 = fVar237 - auVar84._0_4_;
                auVar84 = vshufps_avx(auVar4,auVar4,0xff);
                auVar81 = vfmsub213ss_fma(auVar82,auVar87,auVar84);
                fVar181 = auVar86._0_4_ * auVar87._0_4_;
                auVar82 = vfmsub231ss_fma(ZEXT416((uint)(auVar83._0_4_ * auVar81._0_4_)),
                                          ZEXT416((uint)fVar226),ZEXT416((uint)fVar181));
                fVar234 = auVar82._0_4_;
                fVar181 = auVar5._0_4_ * (fVar181 / fVar234) - fVar237 * (auVar83._0_4_ / fVar234);
                auVar225 = ZEXT464((uint)fVar181);
                fVar240 = fVar240 - fVar181;
                auVar241 = ZEXT464((uint)fVar240);
                fVar239 = (float)local_860._0_4_ -
                          (fVar237 * (fVar226 / fVar234) - auVar5._0_4_ * (auVar81._0_4_ / fVar234))
                ;
                auVar232 = ZEXT464((uint)fVar239);
                auVar217._8_4_ = 0x7fffffff;
                auVar217._0_8_ = 0x7fffffff7fffffff;
                auVar217._12_4_ = 0x7fffffff;
                auVar83 = vandps_avx(auVar5,auVar217);
                bVar77 = true;
                fVar226 = (float)local_740._0_4_;
                fVar181 = (float)local_740._4_4_;
                fVar234 = fStack_738;
                fVar236 = fStack_734;
                fVar238 = fStack_730;
                fVar159 = fStack_72c;
                fVar161 = fStack_728;
                fVar163 = fStack_724;
                if (auVar83._0_4_ < auVar6._0_4_) {
                  auVar5 = vfmadd231ss_fma(ZEXT416((uint)(auVar6._0_4_ + auVar85._0_4_)),local_620,
                                           ZEXT416(0x36000000));
                  auVar83 = vandps_avx(ZEXT416((uint)fVar237),auVar217);
                  if (auVar83._0_4_ < auVar5._0_4_) {
                    fVar239 = fVar239 + (float)local_610._0_4_;
                    auVar232 = ZEXT464((uint)fVar239);
                    if ((ray->org).field_0.m128[3] <= fVar239) {
                      fVar237 = ray->tfar;
                      auVar225 = ZEXT464((uint)fVar237);
                      if (((fVar239 <= fVar237) && (0.0 <= fVar240)) && (fVar240 <= 1.0)) {
                        auVar130._0_16_ = ZEXT816(0) << 0x20;
                        auVar129._4_28_ = auVar130._4_28_;
                        auVar129._0_4_ = local_720._0_4_;
                        auVar83 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar129._0_16_);
                        fVar245 = auVar83._0_4_;
                        auVar83 = vmulss_avx512f(local_720._0_16_,ZEXT416(0xbf000000));
                        pGVar8 = (local_8c8->scene->geometries).items[local_868].ptr;
                        if ((pGVar8->mask & ray->mask) != 0) {
                          if ((local_8c8->args->filter == (RTCFilterFunctionN)0x0) &&
                             (pGVar8->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                            unaff_R12 = 1;
                          }
                          else {
                            fVar226 = fVar245 * 1.5 + auVar83._0_4_ * fVar245 * fVar245 * fVar245;
                            auVar177._0_4_ = local_700._0_4_ * fVar226;
                            auVar177._4_4_ = local_700._4_4_ * fVar226;
                            auVar177._8_4_ = local_700._8_4_ * fVar226;
                            auVar177._12_4_ = local_700._12_4_ * fVar226;
                            auVar81 = vfmadd213ps_fma(auVar84,auVar177,auVar4);
                            auVar83 = vshufps_avx(auVar177,auVar177,0xc9);
                            auVar84 = vshufps_avx(auVar4,auVar4,0xc9);
                            auVar178._0_4_ = auVar177._0_4_ * auVar84._0_4_;
                            auVar178._4_4_ = auVar177._4_4_ * auVar84._4_4_;
                            auVar178._8_4_ = auVar177._8_4_ * auVar84._8_4_;
                            auVar178._12_4_ = auVar177._12_4_ * auVar84._12_4_;
                            auVar5 = vfmsub231ps_fma(auVar178,auVar4,auVar83);
                            auVar83 = vshufps_avx(auVar5,auVar5,0xc9);
                            auVar84 = vshufps_avx(auVar81,auVar81,0xc9);
                            auVar5 = vshufps_avx(auVar5,auVar5,0xd2);
                            auVar146._0_4_ = auVar81._0_4_ * auVar5._0_4_;
                            auVar146._4_4_ = auVar81._4_4_ * auVar5._4_4_;
                            auVar146._8_4_ = auVar81._8_4_ * auVar5._8_4_;
                            auVar146._12_4_ = auVar81._12_4_ * auVar5._12_4_;
                            auVar84 = vfmsub231ps_fma(auVar146,auVar83,auVar84);
                            auVar83 = vshufps_avx(auVar84,auVar84,0xe9);
                            local_790 = vmovlps_avx(auVar83);
                            local_788 = auVar84._0_4_;
                            local_780 = 0;
                            local_778 = (undefined4)local_868;
                            local_774 = local_8c8->user->instID[0];
                            local_770 = local_8c8->user->instPrimID[0];
                            ray->tfar = fVar239;
                            local_8cc = -1;
                            local_7f0.valid = &local_8cc;
                            local_7f0.geometryUserPtr = pGVar8->userPtr;
                            local_7f0.context = local_8c8->user;
                            local_7f0.hit = (RTCHitN *)&local_790;
                            local_7f0.N = 1;
                            local_8c0._0_16_ = ZEXT416((uint)fVar240);
                            local_860._0_16_ = ZEXT416((uint)fVar239);
                            local_8a0._0_4_ = fVar237;
                            local_7f0.ray = (RTCRayN *)ray;
                            local_784 = fVar240;
                            local_77c = uVar1;
                            if (pGVar8->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01d3cc81:
                              p_Var9 = local_8c8->args->filter;
                              fVar226 = (float)local_740._0_4_;
                              fVar181 = (float)local_740._4_4_;
                              fVar234 = fStack_738;
                              fVar236 = fStack_734;
                              fVar238 = fStack_730;
                              fVar159 = fStack_72c;
                              fVar161 = fStack_728;
                              fVar163 = fStack_724;
                              if (p_Var9 != (RTCFilterFunctionN)0x0) {
                                if (((local_8c8->args->flags &
                                     RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                     RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                                   (((pGVar8->field_8).field_0x2 & 0x40) != 0)) {
                                  auVar233 = ZEXT1664(auVar233._0_16_);
                                  auVar244 = ZEXT1664(auVar244._0_16_);
                                  auVar248 = ZEXT1664(auVar248._0_16_);
                                  auVar250 = ZEXT1664(auVar250._0_16_);
                                  (*p_Var9)(&local_7f0);
                                  auVar225 = ZEXT464((uint)local_8a0._0_4_);
                                  auVar232 = ZEXT1664(local_860._0_16_);
                                  auVar241 = ZEXT1664(local_8c0._0_16_);
                                  auVar94 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                  auVar251 = ZEXT3264(auVar94);
                                  fVar226 = (float)local_740._0_4_;
                                  fVar181 = (float)local_740._4_4_;
                                  fVar234 = fStack_738;
                                  fVar236 = fStack_734;
                                  fVar238 = fStack_730;
                                  fVar159 = fStack_72c;
                                  fVar161 = fStack_728;
                                  fVar163 = fStack_724;
                                }
                                if (*local_7f0.valid == 0) goto LAB_01d3cce7;
                              }
                              unaff_R12 = 1;
                            }
                            else {
                              auVar233 = ZEXT1664(local_700._0_16_);
                              auVar244 = ZEXT1664(local_820);
                              auVar248 = ZEXT1664(auVar4);
                              auVar250 = ZEXT1664(auVar6);
                              (*pGVar8->occlusionFilterN)(&local_7f0);
                              auVar225 = ZEXT464((uint)local_8a0._0_4_);
                              auVar232 = ZEXT1664(local_860._0_16_);
                              auVar241 = ZEXT1664(local_8c0._0_16_);
                              auVar94 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                              auVar251 = ZEXT3264(auVar94);
                              fVar226 = (float)local_740._0_4_;
                              fVar181 = (float)local_740._4_4_;
                              fVar234 = fStack_738;
                              fVar236 = fStack_734;
                              fVar238 = fStack_730;
                              fVar159 = fStack_72c;
                              fVar161 = fStack_728;
                              fVar163 = fStack_724;
                              if (*local_7f0.valid != 0) goto LAB_01d3cc81;
LAB_01d3cce7:
                              unaff_R12 = 0;
                            }
                            if ((char)unaff_R12 == '\0') {
                              ray->tfar = auVar225._0_4_;
                            }
                          }
                          bVar77 = false;
                          goto LAB_01d3cb08;
                        }
                      }
                    }
                    bVar77 = false;
                    unaff_R12 = 0;
                  }
                }
LAB_01d3cb08:
                bVar70 = (byte)unaff_R12;
                if (!bVar77) goto LAB_01d3cd01;
                lVar76 = lVar76 + -1;
              } while (lVar76 != 0);
              bVar70 = 0;
LAB_01d3cd01:
              unaff_R12 = (ulong)(bVar70 & 1);
              bVar75 = bVar75 | bVar70 & 1;
              auVar65._4_4_ = fStack_55c;
              auVar65._0_4_ = local_560;
              auVar65._8_4_ = fStack_558;
              auVar65._12_4_ = fStack_554;
              auVar65._16_4_ = fStack_550;
              auVar65._20_4_ = fStack_54c;
              auVar65._24_4_ = fStack_548;
              auVar65._28_4_ = fStack_544;
              fVar235 = ray->tfar;
              auVar32._4_4_ = fVar235;
              auVar32._0_4_ = fVar235;
              auVar32._8_4_ = fVar235;
              auVar32._12_4_ = fVar235;
              auVar32._16_4_ = fVar235;
              auVar32._20_4_ = fVar235;
              auVar32._24_4_ = fVar235;
              auVar32._28_4_ = fVar235;
              uVar17 = vcmpps_avx512vl(auVar65,auVar32,2);
              bVar73 = ~('\x01' << ((byte)iVar20 & 0x1f)) & bVar73 & (byte)uVar17;
            } while (bVar73 != 0);
          }
          uVar18 = vpcmpd_avx512vl(local_500,_local_580,1);
          uVar19 = vpcmpd_avx512vl(local_500,local_3e0,1);
          auVar179._0_4_ = fVar226 + (float)local_460._0_4_;
          auVar179._4_4_ = fVar181 + (float)local_460._4_4_;
          auVar179._8_4_ = fVar234 + fStack_458;
          auVar179._12_4_ = fVar236 + fStack_454;
          auVar179._16_4_ = fVar238 + fStack_450;
          auVar179._20_4_ = fVar159 + fStack_44c;
          auVar179._24_4_ = fVar161 + fStack_448;
          auVar179._28_4_ = fVar163 + fStack_444;
          fVar203 = ray->tfar;
          auVar196._4_4_ = fVar203;
          auVar196._0_4_ = fVar203;
          auVar196._8_4_ = fVar203;
          auVar196._12_4_ = fVar203;
          auVar196._16_4_ = fVar203;
          auVar196._20_4_ = fVar203;
          auVar196._24_4_ = fVar203;
          auVar196._28_4_ = fVar203;
          uVar17 = vcmpps_avx512vl(auVar179,auVar196,2);
          bVar73 = (byte)local_7f8 & (byte)uVar19 & (byte)uVar17;
          auVar212._0_4_ = fVar226 + (float)local_420._0_4_;
          auVar212._4_4_ = fVar181 + (float)local_420._4_4_;
          auVar212._8_4_ = fVar234 + fStack_418;
          auVar212._12_4_ = fVar236 + fStack_414;
          auVar212._16_4_ = fVar238 + fStack_410;
          auVar212._20_4_ = fVar159 + fStack_40c;
          auVar212._24_4_ = fVar161 + fStack_408;
          auVar212._28_4_ = fVar163 + fStack_404;
          uVar17 = vcmpps_avx512vl(auVar212,auVar196,2);
          bVar68 = bVar68 & (byte)uVar18 & (byte)uVar17 | bVar73;
          if (bVar68 != 0) {
            uVar79 = local_748 & 0xffffffff;
            abStack_180[uVar79 * 0x60] = bVar68;
            auVar131._0_4_ =
                 (uint)(bVar73 & 1) * local_460._0_4_ | (uint)!(bool)(bVar73 & 1) * local_420._0_4_;
            bVar77 = (bool)(bVar73 >> 1 & 1);
            auVar131._4_4_ = (uint)bVar77 * local_460._4_4_ | (uint)!bVar77 * local_420._4_4_;
            bVar77 = (bool)(bVar73 >> 2 & 1);
            auVar131._8_4_ = (uint)bVar77 * (int)fStack_458 | (uint)!bVar77 * (int)fStack_418;
            bVar77 = (bool)(bVar73 >> 3 & 1);
            auVar131._12_4_ = (uint)bVar77 * (int)fStack_454 | (uint)!bVar77 * (int)fStack_414;
            bVar77 = (bool)(bVar73 >> 4 & 1);
            auVar131._16_4_ = (uint)bVar77 * (int)fStack_450 | (uint)!bVar77 * (int)fStack_410;
            bVar77 = (bool)(bVar73 >> 5 & 1);
            auVar131._20_4_ = (uint)bVar77 * (int)fStack_44c | (uint)!bVar77 * (int)fStack_40c;
            bVar77 = (bool)(bVar73 >> 6 & 1);
            auVar131._24_4_ = (uint)bVar77 * (int)fStack_448 | (uint)!bVar77 * (int)fStack_408;
            auVar131._28_4_ =
                 (uint)(bVar73 >> 7) * (int)fStack_444 |
                 (uint)!(bool)(bVar73 >> 7) * (int)fStack_404;
            *(undefined1 (*) [32])(auStack_160 + uVar79 * 0x60) = auVar131;
            uVar17 = vmovlps_avx(local_630);
            *(undefined8 *)(afStack_140 + uVar79 * 0x18) = uVar17;
            auStack_138[uVar79 * 0x18] = (int)local_808 + 1;
            local_748 = (ulong)((int)local_748 + 1);
          }
          auVar213 = ZEXT3264(CONCAT428(0x3f800000,
                                        CONCAT424(0x3f800000,
                                                  CONCAT420(0x3f800000,
                                                            CONCAT416(0x3f800000,
                                                                      CONCAT412(0x3f800000,
                                                                                CONCAT48(0x3f800000,
                                                                                         &
                                                  DAT_3f8000003f800000)))))));
          prim = local_758;
          pPVar74 = local_760;
        }
      }
    }
    fVar203 = ray->tfar;
    auVar155._4_4_ = fVar203;
    auVar155._0_4_ = fVar203;
    auVar155._8_4_ = fVar203;
    auVar155._12_4_ = fVar203;
    auVar155._16_4_ = fVar203;
    auVar155._20_4_ = fVar203;
    auVar155._24_4_ = fVar203;
    auVar155._28_4_ = fVar203;
    uVar79 = local_748;
    do {
      if ((int)uVar79 == 0) {
        if (bVar75 != 0) {
          return bVar78;
        }
        fVar226 = ray->tfar;
        auVar33._4_4_ = fVar226;
        auVar33._0_4_ = fVar226;
        auVar33._8_4_ = fVar226;
        auVar33._12_4_ = fVar226;
        auVar33._16_4_ = fVar226;
        auVar33._20_4_ = fVar226;
        auVar33._24_4_ = fVar226;
        auVar33._28_4_ = fVar226;
        uVar17 = vcmpps_avx512vl(local_3c0,auVar33,2);
        uVar80 = (uint)local_750 & (uint)uVar17;
        local_750 = (ulong)uVar80;
        bVar78 = uVar80 != 0;
        if (!bVar78) {
          return bVar78;
        }
        goto LAB_01d3ab9a;
      }
      uVar71 = (ulong)((int)uVar79 - 1);
      lVar76 = uVar71 * 0x60;
      auVar94 = *(undefined1 (*) [32])(auStack_160 + lVar76);
      auVar197._0_4_ = fVar226 + auVar94._0_4_;
      auVar197._4_4_ = fVar181 + auVar94._4_4_;
      auVar197._8_4_ = fVar234 + auVar94._8_4_;
      auVar197._12_4_ = fVar236 + auVar94._12_4_;
      auVar197._16_4_ = fVar238 + auVar94._16_4_;
      auVar197._20_4_ = fVar159 + auVar94._20_4_;
      auVar197._24_4_ = fVar161 + auVar94._24_4_;
      auVar197._28_4_ = fVar163 + auVar94._28_4_;
      uVar17 = vcmpps_avx512vl(auVar197,auVar155,2);
      uVar80 = (uint)uVar17 & (uint)abStack_180[lVar76];
      bVar68 = (byte)uVar80;
      local_748 = uVar71;
      if (uVar80 != 0) {
        auVar198._8_4_ = 0x7f800000;
        auVar198._0_8_ = 0x7f8000007f800000;
        auVar198._12_4_ = 0x7f800000;
        auVar198._16_4_ = 0x7f800000;
        auVar198._20_4_ = 0x7f800000;
        auVar198._24_4_ = 0x7f800000;
        auVar198._28_4_ = 0x7f800000;
        auVar95 = vblendmps_avx512vl(auVar198,auVar94);
        auVar132._0_4_ =
             (uint)(bVar68 & 1) * auVar95._0_4_ | (uint)!(bool)(bVar68 & 1) * (int)auVar94._0_4_;
        bVar77 = (bool)((byte)(uVar80 >> 1) & 1);
        auVar132._4_4_ = (uint)bVar77 * auVar95._4_4_ | (uint)!bVar77 * (int)auVar94._4_4_;
        bVar77 = (bool)((byte)(uVar80 >> 2) & 1);
        auVar132._8_4_ = (uint)bVar77 * auVar95._8_4_ | (uint)!bVar77 * (int)auVar94._8_4_;
        bVar77 = (bool)((byte)(uVar80 >> 3) & 1);
        auVar132._12_4_ = (uint)bVar77 * auVar95._12_4_ | (uint)!bVar77 * (int)auVar94._12_4_;
        bVar77 = (bool)((byte)(uVar80 >> 4) & 1);
        auVar132._16_4_ = (uint)bVar77 * auVar95._16_4_ | (uint)!bVar77 * (int)auVar94._16_4_;
        bVar77 = (bool)((byte)(uVar80 >> 5) & 1);
        auVar132._20_4_ = (uint)bVar77 * auVar95._20_4_ | (uint)!bVar77 * (int)auVar94._20_4_;
        bVar77 = (bool)((byte)(uVar80 >> 6) & 1);
        auVar132._24_4_ = (uint)bVar77 * auVar95._24_4_ | (uint)!bVar77 * (int)auVar94._24_4_;
        auVar132._28_4_ =
             (uVar80 >> 7) * auVar95._28_4_ | (uint)!SUB41(uVar80 >> 7,0) * (int)auVar94._28_4_;
        auVar94 = vshufps_avx(auVar132,auVar132,0xb1);
        auVar94 = vminps_avx(auVar132,auVar94);
        auVar95 = vshufpd_avx(auVar94,auVar94,5);
        auVar94 = vminps_avx(auVar94,auVar95);
        auVar95 = vpermpd_avx2(auVar94,0x4e);
        auVar94 = vminps_avx(auVar94,auVar95);
        uVar17 = vcmpps_avx512vl(auVar132,auVar94,0);
        bVar73 = (byte)uVar17 & bVar68;
        if (bVar73 != 0) {
          uVar80 = (uint)bVar73;
        }
        fVar203 = afStack_140[uVar71 * 0x18 + 1];
        uVar133 = 0;
        for (; (uVar80 & 1) == 0; uVar80 = uVar80 >> 1 | 0x80000000) {
          uVar133 = uVar133 + 1;
        }
        unaff_R12 = (ulong)auStack_138[uVar71 * 0x18];
        bVar73 = ~('\x01' << ((byte)uVar133 & 0x1f)) & bVar68;
        abStack_180[lVar76] = bVar73;
        auVar213 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                       &
                                                  DAT_3f8000003f800000)))))));
        if (bVar73 != 0) {
          local_748 = uVar79 & 0xffffffff;
        }
        fVar235 = afStack_140[uVar71 * 0x18];
        auVar199._4_4_ = fVar235;
        auVar199._0_4_ = fVar235;
        auVar199._8_4_ = fVar235;
        auVar199._12_4_ = fVar235;
        auVar199._16_4_ = fVar235;
        auVar199._20_4_ = fVar235;
        auVar199._24_4_ = fVar235;
        auVar199._28_4_ = fVar235;
        fVar203 = fVar203 - fVar235;
        auVar180._4_4_ = fVar203;
        auVar180._0_4_ = fVar203;
        auVar180._8_4_ = fVar203;
        auVar180._12_4_ = fVar203;
        auVar180._16_4_ = fVar203;
        auVar180._20_4_ = fVar203;
        auVar180._24_4_ = fVar203;
        auVar180._28_4_ = fVar203;
        auVar83 = vfmadd132ps_fma(auVar180,auVar199,_DAT_02020f20);
        _local_460 = ZEXT1632(auVar83);
        local_630._8_8_ = 0;
        local_630._0_8_ = *(ulong *)(local_460 + (ulong)uVar133 * 4);
        local_808 = unaff_R12;
      }
      uVar79 = local_748;
    } while (bVar68 == 0);
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersector1<M>::intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }
          
          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }